

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  stbi__uint32 sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 z;
  undefined4 z_00;
  undefined4 z_01;
  stbi_uc sVar37;
  byte bVar38;
  uchar uVar39;
  int iVar40;
  stbi__uint32 sVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  int iVar45;
  stbi__jpeg *psVar46;
  long lVar47;
  ulong uVar48;
  stbi__uint16 *data_00;
  uchar *data_01;
  void *pvVar49;
  code *pcVar50;
  stbi__context *psVar51;
  char *pcVar52;
  float *data_02;
  uchar *puVar53;
  byte *pbVar54;
  long lVar55;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  int iVar59;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar60;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  stbi_uc *extraout_RDX_13;
  stbi_uc *extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  stbi_uc *psVar61;
  short sVar62;
  ulong uVar63;
  uint uVar64;
  stbi_uc *psVar65;
  stbi_uc *psVar66;
  short *psVar67;
  undefined7 uVar68;
  undefined4 in_register_00000084;
  long lVar69;
  stbi__result_info *ri_00;
  int iVar70;
  int iVar71;
  ulong uVar72;
  stbi_uc (*pasVar73) [4];
  stbi__context *psVar74;
  int *piVar75;
  uint uVar76;
  uint uVar77;
  stbi__uint16 *psVar78;
  long in_FS_OFFSET;
  bool bVar79;
  undefined1 auVar80 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  int iVar118;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_89c0;
  uint local_8988;
  ulong local_8978;
  int local_8964;
  undefined1 local_8948 [12];
  uint uStack_893c;
  undefined1 local_8938 [12];
  uint uStack_892c;
  int local_8928;
  int *local_8920;
  uint local_8918;
  int local_8914;
  undefined8 local_8910;
  uint local_8904;
  stbi_uc *local_8900;
  int *local_88f8;
  ulong local_88f0;
  long local_88e8;
  stbi__uint32 local_88e0;
  int local_88dc;
  int local_88d8;
  int local_88d4;
  int local_88d0;
  int local_88cc;
  int local_88c8;
  int local_88c4;
  ulong local_88c0;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  psVar61 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  local_8920 = comp;
  psVar46 = (stbi__jpeg *)malloc(0x4888);
  psVar46->s = s;
  psVar46->idct_block_kernel = stbi__idct_simd;
  psVar46->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar46->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar46->jfif = 0;
  psVar46->app14_color_transform = -1;
  psVar46->marker = 0xff;
  sVar37 = stbi__get_marker(psVar46);
  if (sVar37 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0x10) = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar46);
  if (sVar37 == 0xd8) {
    psVar46 = (stbi__jpeg *)malloc(0x4888);
    psVar46->s = s;
    psVar46->idct_block_kernel = stbi__idct_simd;
    psVar46->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar46->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = psVar46->img_comp;
      lVar47 = 0x46d8;
      do {
        psVar61 = psVar46->huff_dc[0].fast + lVar47 + -8;
        psVar61[0] = '\0';
        psVar61[1] = '\0';
        psVar61[2] = '\0';
        psVar61[3] = '\0';
        psVar61[4] = '\0';
        psVar61[5] = '\0';
        psVar61[6] = '\0';
        psVar61[7] = '\0';
        psVar61[8] = '\0';
        psVar61[9] = '\0';
        psVar61[10] = '\0';
        psVar61[0xb] = '\0';
        psVar61[0xc] = '\0';
        psVar61[0xd] = '\0';
        psVar61[0xe] = '\0';
        psVar61[0xf] = '\0';
        lVar47 = lVar47 + 0x60;
      } while (lVar47 != 0x4858);
      psVar46->restart_interval = 0;
      iVar40 = stbi__decode_jpeg_header(psVar46,0);
      uVar76 = extraout_EDX;
      if (iVar40 != 0) {
        bVar38 = stbi__get_marker(psVar46);
        local_88f8 = psVar46->huff_ac[0].delta + 9;
LAB_00144203:
        if (bVar38 == 0xda) {
          iVar40 = stbi__get16be(psVar46->s);
          psVar51 = psVar46->s;
          pbVar54 = psVar51->img_buffer;
          paVar60 = extraout_RDX_00;
          if (pbVar54 < psVar51->img_buffer_end) {
LAB_001442f6:
            psVar51->img_buffer = pbVar54 + 1;
            bVar38 = *pbVar54;
          }
          else {
            if (psVar51->read_from_callbacks != 0) {
              psVar61 = psVar51->buffer_start;
              iVar71 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
              if (iVar71 == 0) {
                psVar51->read_from_callbacks = 0;
                psVar51->img_buffer = psVar61;
                psVar51->img_buffer_end = psVar51->buffer_start + 1;
                psVar51->buffer_start[0] = '\0';
              }
              else {
                psVar51->img_buffer = psVar61;
                psVar51->img_buffer_end = psVar61 + iVar71;
              }
              pbVar54 = psVar51->img_buffer;
              paVar60 = extraout_RDX_01;
              goto LAB_001442f6;
            }
            bVar38 = 0;
          }
          psVar46->scan_n = (uint)bVar38;
          if ((0xfb < (byte)(bVar38 - 5)) && ((int)(uint)bVar38 <= psVar46->s->img_n)) {
            if (iVar40 != (uint)bVar38 * 2 + 6) {
              pcVar52 = "bad SOS len";
              goto LAB_0014667c;
            }
            if (bVar38 != 0) {
              lVar47 = 0;
              do {
                psVar51 = psVar46->s;
                pbVar54 = psVar51->img_buffer;
                if (pbVar54 < psVar51->img_buffer_end) {
LAB_001443b3:
                  psVar51->img_buffer = pbVar54 + 1;
                  uVar64 = (uint)*pbVar54;
                }
                else {
                  if (psVar51->read_from_callbacks != 0) {
                    psVar61 = psVar51->buffer_start;
                    iVar40 = (*(psVar51->io).read)
                                       (psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
                    if (iVar40 == 0) {
                      psVar51->read_from_callbacks = 0;
                      psVar51->img_buffer = psVar61;
                      psVar51->img_buffer_end = psVar51->buffer_start + 1;
                      psVar51->buffer_start[0] = '\0';
                    }
                    else {
                      psVar51->img_buffer = psVar61;
                      psVar51->img_buffer_end = psVar61 + iVar40;
                    }
                    pbVar54 = psVar51->img_buffer;
                    goto LAB_001443b3;
                  }
                  uVar64 = 0;
                }
                psVar51 = psVar46->s;
                pbVar54 = psVar51->img_buffer;
                if (pbVar54 < psVar51->img_buffer_end) {
LAB_00144436:
                  psVar51->img_buffer = pbVar54 + 1;
                  bVar38 = *pbVar54;
                }
                else {
                  if (psVar51->read_from_callbacks != 0) {
                    psVar61 = psVar51->buffer_start;
                    iVar40 = (*(psVar51->io).read)
                                       (psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
                    if (iVar40 == 0) {
                      psVar51->read_from_callbacks = 0;
                      psVar51->img_buffer = psVar61;
                      psVar51->img_buffer_end = psVar51->buffer_start + 1;
                      psVar51->buffer_start[0] = '\0';
                    }
                    else {
                      psVar51->img_buffer = psVar61;
                      psVar51->img_buffer_end = psVar61 + iVar40;
                    }
                    pbVar54 = psVar51->img_buffer;
                    goto LAB_00144436;
                  }
                  bVar38 = 0;
                }
                uVar76 = psVar46->s->img_n;
                if ((int)uVar76 < 1) {
                  uVar63 = 0;
                }
                else {
                  uVar63 = 0;
                  paVar60 = paVar1;
                  do {
                    if (paVar60->id == uVar64) goto LAB_00144468;
                    uVar63 = uVar63 + 1;
                    paVar60 = paVar60 + 1;
                  } while (uVar76 != uVar63);
                  uVar63 = (ulong)uVar76;
                }
LAB_00144468:
                if ((uint)uVar63 == uVar76) goto LAB_00146685;
                uVar72 = uVar63 & 0xffffffff;
                paVar60 = (anon_struct_96_18_0d0905d3 *)(uVar72 * 0x60);
                psVar46->img_comp[uVar72].hd = (uint)(bVar38 >> 4);
                if (0x3f < bVar38) {
                  pcVar52 = "bad DC huff";
                  goto LAB_0014667c;
                }
                paVar60 = paVar1 + uVar72;
                paVar60->ha = bVar38 & 0xf;
                if (3 < (bVar38 & 0xf)) {
                  pcVar52 = "bad AC huff";
                  goto LAB_0014667c;
                }
                psVar46->order[lVar47] = (uint)uVar63;
                lVar47 = lVar47 + 1;
              } while (lVar47 < psVar46->scan_n);
            }
            psVar51 = psVar46->s;
            pbVar54 = psVar51->img_buffer;
            if (pbVar54 < psVar51->img_buffer_end) {
LAB_00144532:
              psVar51->img_buffer = pbVar54 + 1;
              uVar76 = (uint)*pbVar54;
            }
            else {
              if (psVar51->read_from_callbacks != 0) {
                psVar61 = psVar51->buffer_start;
                iVar40 = (*(psVar51->io).read)
                                   (psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
                if (iVar40 == 0) {
                  psVar51->read_from_callbacks = 0;
                  psVar51->img_buffer = psVar61;
                  psVar51->img_buffer_end = psVar51->buffer_start + 1;
                  psVar51->buffer_start[0] = '\0';
                }
                else {
                  psVar51->img_buffer = psVar61;
                  psVar51->img_buffer_end = psVar61 + iVar40;
                }
                pbVar54 = psVar51->img_buffer;
                goto LAB_00144532;
              }
              uVar76 = 0;
            }
            psVar46->spec_start = uVar76;
            psVar51 = psVar46->s;
            pbVar54 = psVar51->img_buffer;
            if (pbVar54 < psVar51->img_buffer_end) {
LAB_001445bb:
              psVar51->img_buffer = pbVar54 + 1;
              uVar76 = (uint)*pbVar54;
            }
            else {
              if (psVar51->read_from_callbacks != 0) {
                psVar61 = psVar51->buffer_start;
                iVar40 = (*(psVar51->io).read)
                                   (psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
                if (iVar40 == 0) {
                  psVar51->read_from_callbacks = 0;
                  psVar51->img_buffer = psVar61;
                  psVar51->img_buffer_end = psVar51->buffer_start + 1;
                  psVar51->buffer_start[0] = '\0';
                }
                else {
                  psVar51->img_buffer = psVar61;
                  psVar51->img_buffer_end = psVar61 + iVar40;
                }
                pbVar54 = psVar51->img_buffer;
                goto LAB_001445bb;
              }
              uVar76 = 0;
            }
            psVar46->spec_end = uVar76;
            psVar51 = psVar46->s;
            pbVar54 = psVar51->img_buffer;
            if (pbVar54 < psVar51->img_buffer_end) {
LAB_00144644:
              psVar51->img_buffer = pbVar54 + 1;
              bVar38 = *pbVar54;
            }
            else {
              if (psVar51->read_from_callbacks != 0) {
                psVar61 = psVar51->buffer_start;
                iVar40 = (*(psVar51->io).read)
                                   (psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
                if (iVar40 == 0) {
                  psVar51->read_from_callbacks = 0;
                  psVar51->img_buffer = psVar61;
                  psVar51->img_buffer_end = psVar51->buffer_start + 1;
                  psVar51->buffer_start[0] = '\0';
                }
                else {
                  psVar51->img_buffer = psVar61;
                  psVar51->img_buffer_end = psVar61 + iVar40;
                }
                pbVar54 = psVar51->img_buffer;
                goto LAB_00144644;
              }
              bVar38 = 0;
            }
            psVar46->succ_high = (uint)(bVar38 >> 4);
            uVar76 = bVar38 & 0xf;
            paVar60 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar76;
            psVar46->succ_low = uVar76;
            iVar40 = psVar46->progressive;
            iVar71 = psVar46->spec_start;
            if (iVar40 == 0) {
              if (((iVar71 != 0) || (0xf < bVar38)) || ((bVar38 & 0xf) != 0)) goto LAB_00145be6;
              psVar46->spec_end = 0x3f;
            }
            else if (((0x3f < iVar71) || (0x3f < psVar46->spec_end)) ||
                    ((psVar46->spec_end < iVar71 || ((0xdf < bVar38 || (0xd < uVar76)))))) {
LAB_00145be6:
              pcVar52 = "bad SOS";
              goto LAB_0014667c;
            }
            iVar71 = psVar46->scan_n;
            uVar63 = (ulong)(uint)psVar46->restart_interval;
            if (psVar46->restart_interval == 0) {
              uVar63 = 0x7fffffff;
            }
            psVar46->code_buffer = 0;
            psVar46->code_bits = 0;
            psVar46->nomore = 0;
            psVar46->img_comp[3].dc_pred = 0;
            psVar46->img_comp[2].dc_pred = 0;
            psVar46->img_comp[1].dc_pred = 0;
            psVar46->img_comp[0].dc_pred = 0;
            psVar46->marker = 0xff;
            uVar76 = (uint)uVar63;
            psVar46->todo = uVar76;
            psVar46->eob_run = 0;
            if (iVar40 == 0) {
              if (iVar71 == 1) {
                iVar40 = psVar46->order[0];
                uVar64 = psVar46->img_comp[iVar40].y + 7 >> 3;
                local_8978 = (ulong)uVar64;
                if (0 < (int)uVar64) {
                  uVar58 = paVar1[iVar40].x + 7 >> 3;
                  iVar71 = 0;
                  uVar56 = 0;
                  do {
                    if (0 < (int)uVar58) {
                      lVar47 = 0;
                      do {
                        iVar70 = stbi__jpeg_decode_block
                                           (psVar46,(short *)&local_88a8,
                                            (stbi__huffman *)
                                            psVar46->huff_dc[paVar1[iVar40].hd].fast,
                                            (stbi__huffman *)
                                            psVar46->huff_ac[paVar1[iVar40].ha].fast,
                                            psVar46->fast_ac[paVar1[iVar40].ha],iVar40,
                                            psVar46->dequant[paVar1[iVar40].tq]);
                        if (iVar70 == 0) {
                          bVar79 = false;
                          local_89c0 = 0;
                          uVar63 = extraout_RDX_07;
                        }
                        else {
                          (*psVar46->idct_block_kernel)
                                    (paVar1[iVar40].data + lVar47 + iVar71 * paVar1[iVar40].w2,
                                     paVar1[iVar40].w2,(short *)&local_88a8);
                          iVar70 = psVar46->todo;
                          psVar46->todo = iVar70 + -1;
                          bVar79 = true;
                          uVar63 = extraout_RDX_08;
                          if (iVar70 < 2) {
                            if (psVar46->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar46);
                              uVar63 = extraout_RDX_09;
                            }
                            if ((psVar46->marker & 0xf8) == 0xd0) {
                              psVar46->code_buffer = 0;
                              psVar46->code_bits = 0;
                              psVar46->nomore = 0;
                              psVar46->img_comp[3].dc_pred = 0;
                              psVar46->img_comp[2].dc_pred = 0;
                              psVar46->img_comp[1].dc_pred = 0;
                              psVar46->img_comp[0].dc_pred = 0;
                              psVar46->marker = 0xff;
                              iVar70 = psVar46->restart_interval;
                              uVar63 = 0x7fffffff;
                              if (iVar70 == 0) {
                                iVar70 = 0x7fffffff;
                              }
                              psVar46->todo = iVar70;
                              psVar46->eob_run = 0;
                            }
                            else {
                              local_89c0 = 1;
                              bVar79 = false;
                            }
                          }
                        }
                        uVar76 = (uint)uVar63;
                        if (!bVar79) {
                          iVar40 = (int)local_89c0;
                          goto LAB_00145593;
                        }
                        lVar47 = lVar47 + 8;
                      } while ((ulong)uVar58 * 8 - lVar47 != 0);
                    }
                    uVar76 = (uint)uVar63;
                    uVar56 = uVar56 + 1;
                    iVar71 = iVar71 + 8;
                  } while (uVar56 != uVar64);
                }
LAB_0014534e:
                iVar40 = 1;
              }
              else {
                iVar40 = 1;
                if (0 < psVar46->img_mcu_y) {
                  iVar71 = 0;
                  do {
                    if (0 < psVar46->img_mcu_x) {
                      iVar70 = 0;
                      do {
                        if (0 < psVar46->scan_n) {
                          lVar47 = 0;
                          do {
                            iVar40 = psVar46->order[lVar47];
                            local_89c0 = (ulong)iVar40;
                            if (0 < psVar46->img_comp[local_89c0].v) {
                              iVar42 = 0;
                              bVar79 = true;
                              do {
                                local_8978 = CONCAT71(local_8978._1_7_,bVar79);
                                iVar44 = paVar1[local_89c0].h;
                                if (0 < iVar44) {
                                  iVar59 = 0;
                                  do {
                                    iVar118 = paVar1[local_89c0].v;
                                    iVar45 = stbi__jpeg_decode_block
                                                       (psVar46,(short *)&local_88a8,
                                                        (stbi__huffman *)
                                                        psVar46->huff_dc[paVar1[local_89c0].hd].fast
                                                        ,(stbi__huffman *)
                                                         psVar46->huff_ac[paVar1[local_89c0].ha].
                                                         fast,psVar46->fast_ac
                                                              [paVar1[local_89c0].ha],iVar40,
                                                        psVar46->dequant[paVar1[local_89c0].tq]);
                                    uVar76 = (uint)extraout_RDX_11;
                                    if (iVar45 == 0) {
                                      uVar63 = extraout_RDX_11;
                                      if (bVar79 != false) goto LAB_00145580;
                                      goto LAB_001454ab;
                                    }
                                    (*psVar46->idct_block_kernel)
                                              (paVar1[local_89c0].data +
                                               (long)((iVar44 * iVar70 + iVar59) * 8) +
                                               (long)((iVar118 * iVar71 + iVar42) *
                                                      paVar1[local_89c0].w2 * 8),
                                               paVar1[local_89c0].w2,(short *)&local_88a8);
                                    iVar59 = iVar59 + 1;
                                    iVar44 = paVar1[local_89c0].h;
                                    uVar63 = extraout_RDX_12;
                                  } while (iVar59 < iVar44);
                                }
                                iVar42 = iVar42 + 1;
                                bVar79 = iVar42 < paVar1[local_89c0].v;
                              } while (iVar42 < paVar1[local_89c0].v);
                            }
LAB_001454ab:
                            lVar47 = lVar47 + 1;
                          } while (lVar47 < psVar46->scan_n);
                        }
                        uVar76 = (uint)uVar63;
                        iVar42 = psVar46->todo;
                        psVar46->todo = iVar42 + -1;
                        iVar40 = 1;
                        if (iVar42 < 2) {
                          if (psVar46->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar46);
                            uVar76 = extraout_EDX_02;
                          }
                          if ((psVar46->marker & 0xf8) != 0xd0) goto LAB_00145593;
                          psVar46->code_buffer = 0;
                          psVar46->code_bits = 0;
                          psVar46->nomore = 0;
                          psVar46->img_comp[3].dc_pred = 0;
                          psVar46->img_comp[2].dc_pred = 0;
                          psVar46->img_comp[1].dc_pred = 0;
                          psVar46->img_comp[0].dc_pred = 0;
                          psVar46->marker = 0xff;
                          iVar40 = psVar46->restart_interval;
                          uVar63 = 0x7fffffff;
                          if (iVar40 == 0) {
                            iVar40 = 0x7fffffff;
                          }
                          psVar46->todo = iVar40;
                          psVar46->eob_run = 0;
                        }
                        iVar70 = iVar70 + 1;
                      } while (iVar70 < psVar46->img_mcu_x);
                    }
                    uVar76 = (uint)uVar63;
                    iVar40 = 1;
                    iVar71 = iVar71 + 1;
                  } while (iVar71 < psVar46->img_mcu_y);
                }
              }
            }
            else if (iVar71 == 1) {
              local_88e8 = (long)psVar46->order[0];
              iVar71 = psVar46->img_comp[local_88e8].y + 7 >> 3;
              iVar40 = 1;
              local_88f0 = CONCAT44(local_88f0._4_4_,iVar71);
              if (0 < iVar71) {
                paVar60 = paVar1 + local_88e8;
                iVar70 = psVar46->img_comp[local_88e8].x + 7 >> 3;
                iVar71 = 0;
                local_8910 = paVar60;
                do {
                  if (0 < iVar70) {
                    iVar40 = 0;
                    do {
                      piVar75 = local_88f8;
                      psVar67 = paVar60->coeff + (paVar60->coeff_w * iVar71 + iVar40) * 0x40;
                      uVar72 = (ulong)psVar46->spec_start;
                      if (uVar72 == 0) {
                        iVar42 = stbi__jpeg_decode_block_prog_dc
                                           (psVar46,psVar67,
                                            (stbi__huffman *)psVar46->huff_dc[paVar60->hd].fast,
                                            (int)local_88e8);
                        uVar63 = extraout_RDX_03;
                        if (iVar42 != 0) goto LAB_00144c1f;
                        bVar79 = false;
                        local_8978 = 0;
                      }
                      else {
                        lVar47 = (long)paVar60->ha;
                        local_89c0 = (ulong)(uint)psVar46->succ_low;
                        iVar42 = psVar46->eob_run;
                        bVar38 = (byte)psVar46->succ_low;
                        if (psVar46->succ_high == 0) {
                          if (iVar42 == 0) {
                            do {
                              if (psVar46->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar46);
                              }
                              sVar62 = psVar46->fast_ac[lVar47][psVar46->code_buffer >> 0x17];
                              uVar76 = (uint)sVar62;
                              iVar42 = (int)uVar72;
                              if (sVar62 == 0) {
                                if (psVar46->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar46);
                                }
                                uVar76 = psVar46->code_buffer;
                                uVar48 = (ulong)uVar76;
                                uVar63 = (ulong)psVar46->huff_ac[lVar47].fast[uVar76 >> 0x17];
                                if (uVar63 == 0xff) {
                                  lVar55 = 0;
                                  do {
                                    lVar69 = lVar55;
                                    lVar55 = lVar69 + 1;
                                  } while ((uint)piVar75[lVar47 * 0x1a4 + lVar69 + -0x11] <=
                                           uVar76 >> 0x10);
                                  iVar44 = psVar46->code_bits;
                                  if (lVar55 == 8) {
                                    psVar46->code_bits = iVar44 + -0x10;
                                    uVar64 = 0xffffffff;
                                  }
                                  else {
                                    uVar64 = 0xffffffff;
                                    if ((int)(lVar69 + 10) <= iVar44) {
                                      uVar64 = stbi__bmask[lVar69 + 10];
                                      iVar59 = piVar75[lVar47 * 0x1a4 + lVar55];
                                      uVar58 = uVar76 << ((byte)(lVar69 + 10) & 0x1f);
                                      psVar46->code_bits = (iVar44 - (int)lVar55) + -9;
                                      psVar46->code_buffer = uVar58;
                                      uVar63 = (ulong)(int)((uVar76 >> (0x17U - (char)lVar55 & 0x1f)
                                                            & uVar64) + iVar59);
                                      goto LAB_00144e4f;
                                    }
                                  }
                                }
                                else {
                                  bVar2 = psVar46->huff_ac[lVar47].size[uVar63];
                                  uVar64 = 0xffffffff;
                                  if ((int)(uint)bVar2 <= psVar46->code_bits) {
                                    uVar58 = uVar76 << (bVar2 & 0x1f);
                                    psVar46->code_buffer = uVar58;
                                    psVar46->code_bits = psVar46->code_bits - (uint)bVar2;
LAB_00144e4f:
                                    uVar48 = (ulong)uVar58;
                                    uVar64 = (uint)psVar46->huff_ac[lVar47].values[uVar63];
                                  }
                                }
                                if ((int)uVar64 < 0) {
                                  *(char **)(in_FS_OFFSET + -0x10) = "bad huffman code";
                                  iVar44 = 1;
                                }
                                else {
                                  uVar76 = uVar64 >> 4;
                                  uVar58 = uVar64 & 0xf;
                                  if (uVar58 != 0) {
                                    bVar2 = ""[(long)iVar42 + (ulong)uVar76];
                                    if (psVar46->code_bits < (int)uVar58) {
                                      stbi__grow_buffer_unsafe(psVar46);
                                    }
                                    uVar64 = psVar46->code_buffer;
                                    uVar43 = uVar64 << (sbyte)uVar58 |
                                             uVar64 >> 0x20 - (sbyte)uVar58;
                                    uVar56 = *(uint *)((long)stbi__bmask + (ulong)(uVar58 * 4));
                                    psVar46->code_buffer = ~uVar56 & uVar43;
                                    psVar46->code_bits = psVar46->code_bits - uVar58;
                                    iVar44 = 0;
                                    iVar59 = 0;
                                    if (-1 < (int)uVar64) {
                                      iVar59 = *(int *)((long)stbi__jbias + (ulong)(uVar58 * 4));
                                    }
                                    iVar59 = (uVar43 & uVar56) + iVar59 << (bVar38 & 0x1f);
                                    uVar72 = (ulong)((int)((long)iVar42 + (ulong)uVar76) + 1);
                                    psVar67[bVar2] = (short)iVar59;
                                    uVar63 = CONCAT71((uint7)(uint3)((uint)iVar59 >> 8),1);
                                    goto LAB_00144f9f;
                                  }
                                  if (0xef < uVar64) {
                                    uVar64 = iVar42 + 0x10;
                                    goto LAB_00144d67;
                                  }
                                  psVar46->eob_run = 1 << ((byte)uVar76 & 0x1f);
                                  if (0xf < uVar64) {
                                    if (psVar46->code_bits < (int)uVar76) {
                                      stbi__grow_buffer_unsafe(psVar46);
                                    }
                                    bVar2 = (byte)uVar76 & 0x1f;
                                    uVar58 = psVar46->code_buffer << bVar2 |
                                             psVar46->code_buffer >> 0x20 - bVar2;
                                    uVar64 = stbi__bmask[uVar76];
                                    psVar46->code_buffer = ~uVar64 & uVar58;
                                    psVar46->code_bits = psVar46->code_bits - uVar76;
                                    psVar46->eob_run = psVar46->eob_run + (uVar58 & uVar64);
                                  }
                                  psVar46->eob_run = psVar46->eob_run + -1;
                                  iVar44 = 2;
                                }
                                uVar63 = 0;
                              }
                              else {
                                psVar46->code_buffer = psVar46->code_buffer << (sbyte)(uVar76 & 0xf)
                                ;
                                uVar48 = (ulong)(uVar76 >> 4 & 0xf);
                                psVar46->code_bits = psVar46->code_bits - (uVar76 & 0xf);
                                uVar64 = (int)((long)iVar42 + uVar48) + 1;
                                psVar67[""[(long)iVar42 + uVar48]] =
                                     (short)((uVar76 >> 8) << (bVar38 & 0x1f));
LAB_00144d67:
                                uVar72 = (ulong)uVar64;
                                iVar44 = 0;
                                uVar63 = CONCAT71((int7)(uVar48 >> 8),1);
                              }
LAB_00144f9f:
                              bVar79 = false;
                              uVar48 = 1;
                              if (iVar44 != 0) {
                                bVar79 = false;
                                if (iVar44 != 2) {
                                  uVar48 = uVar63;
                                  bVar79 = false;
                                }
                                break;
                              }
                            } while ((int)uVar72 <= psVar46->spec_end);
                          }
                          else {
                            psVar46->eob_run = iVar42 + -1;
                            uVar48 = 0;
                            bVar79 = true;
                          }
                          if ((char)uVar48 != '\0') goto LAB_00144bf5;
                        }
                        else {
                          if (iVar42 == 0) {
                            uVar76 = (0x10000 << (bVar38 & 0x1f)) >> 0x10;
                            do {
                              if (psVar46->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar46);
                              }
                              uVar64 = psVar46->code_buffer;
                              uVar63 = (ulong)uVar64;
                              uVar48 = (ulong)psVar46->huff_ac[lVar47].fast[uVar64 >> 0x17];
                              if (uVar48 == 0xff) {
                                lVar55 = 0;
                                do {
                                  lVar69 = lVar55;
                                  lVar55 = lVar69 + 1;
                                } while ((uint)piVar75[lVar47 * 0x1a4 + lVar69 + -0x11] <=
                                         uVar64 >> 0x10);
                                iVar42 = psVar46->code_bits;
                                if (lVar55 == 8) {
                                  psVar46->code_bits = iVar42 + -0x10;
                                  uVar58 = 0xffffffff;
                                }
                                else {
                                  uVar58 = 0xffffffff;
                                  if ((int)(lVar69 + 10) <= iVar42) {
                                    uVar58 = stbi__bmask[lVar69 + 10];
                                    iVar44 = piVar75[lVar47 * 0x1a4 + lVar55];
                                    uVar56 = uVar64 << ((byte)(lVar69 + 10) & 0x1f);
                                    psVar46->code_bits = (iVar42 - (int)lVar55) + -9;
                                    psVar46->code_buffer = uVar56;
                                    uVar48 = (ulong)(int)((uVar64 >> (0x17U - (char)lVar55 & 0x1f) &
                                                          uVar58) + iVar44);
                                    goto LAB_00144a0f;
                                  }
                                }
                              }
                              else {
                                bVar2 = psVar46->huff_ac[lVar47].size[uVar48];
                                uVar58 = 0xffffffff;
                                if ((int)(uint)bVar2 <= psVar46->code_bits) {
                                  uVar56 = uVar64 << (bVar2 & 0x1f);
                                  psVar46->code_buffer = uVar56;
                                  psVar46->code_bits = psVar46->code_bits - (uint)bVar2;
LAB_00144a0f:
                                  uVar63 = (ulong)uVar56;
                                  uVar58 = (uint)psVar46->huff_ac[lVar47].values[uVar48];
                                }
                              }
                              if ((int)uVar58 < 0) {
                                *(char **)(in_FS_OFFSET + -0x10) = "bad huffman code";
                                bVar79 = false;
                              }
                              else {
                                uVar64 = uVar58 >> 4;
                                if ((uVar58 & 0xf) == 1) {
                                  if (psVar46->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar46);
                                    uVar63 = extraout_RDX_04;
                                  }
                                  uVar58 = psVar46->code_buffer;
                                  psVar46->code_buffer = uVar58 * 2;
                                  psVar46->code_bits = psVar46->code_bits + -1;
                                  sVar62 = (short)(((int)~uVar58 >> 0x1f | 1U) << (bVar38 & 0x1f));
                                }
                                else {
                                  if ((uVar58 & 0xf) != 0) {
                                    *(char **)(in_FS_OFFSET + -0x10) = "bad huffman code";
                                    bVar79 = false;
                                    goto LAB_00144be0;
                                  }
                                  if (uVar58 < 0xf0) {
                                    psVar46->eob_run = ~(-1 << ((byte)uVar64 & 0x1f));
                                    uVar56 = 0x40;
                                    if (0xf < uVar58) {
                                      if (psVar46->code_bits < (int)uVar64) {
                                        stbi__grow_buffer_unsafe(psVar46);
                                      }
                                      bVar2 = (byte)uVar64 & 0x1f;
                                      uVar43 = psVar46->code_buffer << bVar2 |
                                               psVar46->code_buffer >> 0x20 - bVar2;
                                      uVar58 = stbi__bmask[uVar64];
                                      uVar57 = ~uVar58 & uVar43;
                                      uVar63 = (ulong)uVar57;
                                      psVar46->code_buffer = uVar57;
                                      psVar46->code_bits = psVar46->code_bits - uVar64;
                                      psVar46->eob_run = psVar46->eob_run + (uVar43 & uVar58);
                                    }
                                  }
                                  else {
                                    uVar56 = 0xf;
                                  }
                                  uVar64 = uVar56;
                                  sVar62 = 0;
                                }
                                uVar72 = (ulong)(int)uVar72;
                                do {
                                  if ((long)psVar46->spec_end < (long)uVar72) break;
                                  bVar2 = ""[uVar72];
                                  if (psVar67[bVar2] == 0) {
                                    if (uVar64 == 0) {
                                      psVar67[bVar2] = sVar62;
                                      bVar79 = false;
                                      uVar64 = 0;
                                    }
                                    else {
                                      uVar64 = uVar64 - 1;
                                      bVar79 = true;
                                    }
                                  }
                                  else {
                                    if (psVar46->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(psVar46);
                                      uVar63 = extraout_RDX_05;
                                    }
                                    sVar41 = psVar46->code_buffer;
                                    psVar46->code_buffer = sVar41 * 2;
                                    psVar46->code_bits = psVar46->code_bits + -1;
                                    bVar79 = true;
                                    if (((int)sVar41 < 0) &&
                                       (sVar3 = psVar67[bVar2], (uVar76 & (int)sVar3) == 0)) {
                                      uVar58 = uVar76;
                                      if (sVar3 < 1) {
                                        uVar58 = -uVar76;
                                      }
                                      psVar67[bVar2] = sVar3 + (short)uVar58;
                                    }
                                  }
                                  uVar72 = uVar72 + 1;
                                } while (bVar79);
                                bVar79 = true;
                              }
LAB_00144be0:
                              if (!bVar79) {
                                bVar79 = false;
                                goto LAB_00144bfa;
                              }
                            } while ((int)uVar72 <= psVar46->spec_end);
                          }
                          else {
                            psVar46->eob_run = iVar42 + -1;
                            if (psVar46->spec_start <= psVar46->spec_end) {
                              uVar76 = (0x10000 << (bVar38 & 0x1f)) >> 0x10;
                              do {
                                bVar38 = ""[uVar72];
                                if (psVar67[bVar38] != 0) {
                                  if (psVar46->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar46);
                                    uVar63 = extraout_RDX_02;
                                  }
                                  sVar41 = psVar46->code_buffer;
                                  psVar46->code_buffer = sVar41 * 2;
                                  psVar46->code_bits = psVar46->code_bits + -1;
                                  if (((int)sVar41 < 0) &&
                                     (sVar62 = psVar67[bVar38], (uVar76 & (int)sVar62) == 0)) {
                                    uVar64 = -uVar76;
                                    if (0 < sVar62) {
                                      uVar64 = uVar76;
                                    }
                                    psVar67[bVar38] = (short)uVar64 + sVar62;
                                  }
                                }
                                bVar79 = (long)uVar72 < (long)psVar46->spec_end;
                                uVar72 = uVar72 + 1;
                              } while (bVar79);
                            }
                          }
LAB_00144bf5:
                          bVar79 = true;
                        }
LAB_00144bfa:
                        if (!bVar79) {
                          local_8978._0_4_ = 0;
                        }
                        local_8978 = (ulong)(uint)local_8978;
                        paVar60 = local_8910;
                        if (!bVar79) {
                          bVar79 = false;
                        }
                        else {
LAB_00144c1f:
                          iVar42 = psVar46->todo;
                          psVar46->todo = iVar42 + -1;
                          bVar79 = true;
                          if (iVar42 < 2) {
                            if (psVar46->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar46);
                              uVar63 = extraout_RDX_06;
                            }
                            if ((psVar46->marker & 0xf8) == 0xd0) {
                              psVar46->code_buffer = 0;
                              psVar46->code_bits = 0;
                              psVar46->nomore = 0;
                              psVar46->img_comp[3].dc_pred = 0;
                              psVar46->img_comp[2].dc_pred = 0;
                              psVar46->img_comp[1].dc_pred = 0;
                              psVar46->img_comp[0].dc_pred = 0;
                              psVar46->marker = 0xff;
                              iVar42 = psVar46->restart_interval;
                              uVar63 = 0x7fffffff;
                              if (iVar42 == 0) {
                                iVar42 = 0x7fffffff;
                              }
                              psVar46->todo = iVar42;
                              psVar46->eob_run = 0;
                            }
                            else {
                              local_8978 = 1;
                              bVar79 = false;
                            }
                          }
                        }
                      }
                      uVar76 = (uint)uVar63;
                      if (!bVar79) {
                        iVar40 = (int)local_8978;
                        goto LAB_00145593;
                      }
                      iVar40 = iVar40 + 1;
                    } while (iVar40 != iVar70);
                  }
                  uVar76 = (uint)uVar63;
                  iVar40 = 1;
                  iVar71 = iVar71 + 1;
                } while (iVar71 != (int)local_88f0);
              }
            }
            else {
              iVar40 = 1;
              if (0 < psVar46->img_mcu_y) {
                iVar40 = 0;
                do {
                  if (0 < psVar46->img_mcu_x) {
                    iVar71 = 0;
                    do {
                      if (0 < psVar46->scan_n) {
                        uVar72 = 0;
                        do {
                          local_89c0 = uVar72;
                          iVar70 = psVar46->order[local_89c0];
                          if (0 < psVar46->img_comp[iVar70].v) {
                            iVar42 = 0;
                            bVar79 = true;
                            do {
                              iVar44 = paVar1[iVar70].h;
                              if (0 < iVar44) {
                                iVar59 = 0;
                                do {
                                  iVar44 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar46,paVar1[iVar70].coeff +
                                                              (iVar44 * iVar71 + iVar59 +
                                                              (paVar1[iVar70].v * iVar40 + iVar42) *
                                                              paVar1[iVar70].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar46->huff_dc[paVar1[iVar70].hd].fast,
                                                      iVar70);
                                  uVar76 = (uint)extraout_RDX_10;
                                  uVar63 = extraout_RDX_10;
                                  if (iVar44 == 0) {
                                    if (bVar79) goto LAB_00145580;
                                    goto LAB_00145290;
                                  }
                                  iVar59 = iVar59 + 1;
                                  iVar44 = paVar1[iVar70].h;
                                } while (iVar59 < iVar44);
                              }
                              iVar42 = iVar42 + 1;
                              bVar79 = iVar42 < paVar1[iVar70].v;
                            } while (iVar42 < paVar1[iVar70].v);
                          }
LAB_00145290:
                          uVar72 = local_89c0 + 1;
                        } while ((long)(local_89c0 + 1) < (long)psVar46->scan_n);
                      }
                      uVar76 = (uint)uVar63;
                      iVar70 = psVar46->todo;
                      psVar46->todo = iVar70 + -1;
                      if (iVar70 < 2) {
                        if (psVar46->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar46);
                          uVar76 = extraout_EDX_01;
                        }
                        if ((psVar46->marker & 0xf8) != 0xd0) goto LAB_0014534e;
                        psVar46->code_buffer = 0;
                        psVar46->code_bits = 0;
                        psVar46->nomore = 0;
                        psVar46->img_comp[3].dc_pred = 0;
                        psVar46->img_comp[2].dc_pred = 0;
                        psVar46->img_comp[1].dc_pred = 0;
                        psVar46->img_comp[0].dc_pred = 0;
                        psVar46->marker = 0xff;
                        iVar70 = psVar46->restart_interval;
                        uVar63 = 0x7fffffff;
                        if (iVar70 == 0) {
                          iVar70 = 0x7fffffff;
                        }
                        psVar46->todo = iVar70;
                        psVar46->eob_run = 0;
                      }
                      iVar71 = iVar71 + 1;
                    } while (iVar71 < psVar46->img_mcu_x);
                  }
                  uVar76 = (uint)uVar63;
                  iVar40 = iVar40 + 1;
                } while (iVar40 < psVar46->img_mcu_y);
                goto LAB_0014534e;
              }
            }
            goto LAB_00145593;
          }
          pcVar52 = "bad SOS component count";
LAB_0014667c:
          uVar76 = (uint)paVar60;
          *(char **)(in_FS_OFFSET + -0x10) = pcVar52;
        }
        else {
          if (bVar38 == 0xdc) {
            iVar40 = stbi__get16be(psVar46->s);
            sVar41 = stbi__get16be(psVar46->s);
            paVar60 = extraout_RDX;
            if (iVar40 == 4) {
              if (sVar41 == psVar46->s->img_y) goto LAB_001455a4;
              pcVar52 = "bad DNL height";
            }
            else {
              pcVar52 = "bad DNL len";
            }
            goto LAB_0014667c;
          }
          if (bVar38 == 0xd9) {
            if ((psVar46->progressive != 0) && (0 < psVar46->s->img_n)) {
              lVar47 = 0;
              do {
                iVar40 = psVar46->img_comp[lVar47].y + 7 >> 3;
                if (0 < iVar40) {
                  uVar76 = paVar1[lVar47].x + 7 >> 3;
                  iVar71 = 0;
                  do {
                    if (0 < (int)uVar76) {
                      uVar63 = 0;
                      do {
                        psVar67 = paVar1[lVar47].coeff +
                                  (paVar1[lVar47].coeff_w * iVar71 + (int)uVar63) * 0x40;
                        iVar70 = paVar1[lVar47].tq;
                        lVar55 = 0;
                        do {
                          psVar67[lVar55] = psVar67[lVar55] * psVar46->dequant[iVar70][lVar55];
                          lVar55 = lVar55 + 1;
                        } while (lVar55 != 0x40);
                        (*psVar46->idct_block_kernel)
                                  (paVar1[lVar47].data +
                                   uVar63 * 8 + (long)(iVar71 * 8 * paVar1[lVar47].w2),
                                   paVar1[lVar47].w2,psVar67);
                        uVar63 = uVar63 + 1;
                      } while (uVar63 != uVar76);
                    }
                    iVar71 = iVar71 + 1;
                  } while (iVar71 != iVar40);
                }
                lVar47 = lVar47 + 1;
              } while (lVar47 < psVar46->s->img_n);
            }
            if (req_comp == 0) {
              req_comp = (uint)(2 < psVar46->s->img_n) * 2 + 1;
            }
            uVar76 = psVar46->s->img_n;
            if (uVar76 == 3) {
              bVar79 = true;
              if (psVar46->rgb != 3) {
                if (psVar46->app14_color_transform != 0) goto LAB_00145e2f;
                bVar79 = psVar46->jfif == 0;
              }
            }
            else {
LAB_00145e2f:
              bVar79 = false;
            }
            uVar64 = 1;
            if (bVar79) {
              uVar64 = uVar76;
            }
            if (2 < req_comp) {
              uVar64 = uVar76;
            }
            if (uVar76 != 3) {
              uVar64 = uVar76;
            }
            _local_8938 = (undefined1  [16])0x0;
            _local_8948 = (undefined1  [16])0x0;
            if (0 < (int)uVar64) {
              lVar47 = 0;
              while( true ) {
                psVar51 = psVar46->s;
                sVar41 = psVar51->img_x;
                pvVar49 = malloc((ulong)(sVar41 + 3));
                *(void **)((long)&psVar46->img_comp[0].linebuf + lVar47 * 2) = pvVar49;
                if (pvVar49 == (void *)0x0) {
                  stbi__free_jpeg_components(psVar46,psVar51->img_n,why);
                  *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
                }
                else {
                  uVar63 = (long)psVar46->img_h_max /
                           (long)*(int *)((long)&psVar46->img_comp[0].h + lVar47 * 2);
                  iVar40 = (int)uVar63;
                  *(int *)((long)(local_88a8.pal + -7) + lVar47) = iVar40;
                  iVar71 = psVar46->img_v_max / *(int *)((long)&psVar46->img_comp[0].v + lVar47 * 2)
                  ;
                  *(int *)((long)(local_88a8.pal + -6) + lVar47) = iVar71;
                  *(int *)((long)(local_88a8.pal + -4) + lVar47) = iVar71 >> 1;
                  *(int *)((long)(local_88a8.pal + -5) + lVar47) =
                       (int)((ulong)((sVar41 + iVar40) - 1) / (uVar63 & 0xffffffff));
                  *(undefined4 *)((long)(local_88a8.pal + -3) + lVar47) = 0;
                  uVar7 = *(undefined8 *)((long)&psVar46->img_comp[0].data + lVar47 * 2);
                  *(undefined8 *)((long)(local_88a8.pal + -9) + lVar47) = uVar7;
                  *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar47) = uVar7;
                  if ((iVar40 == 1) && (iVar71 == 1)) {
                    pcVar50 = resample_row_1;
                  }
                  else if ((iVar40 == 1) && (iVar71 == 2)) {
                    pcVar50 = stbi__resample_row_v_2;
                  }
                  else if ((iVar40 == 2) && (iVar71 == 1)) {
                    pcVar50 = stbi__resample_row_h_2;
                  }
                  else if ((iVar40 == 2) && (iVar71 == 2)) {
                    pcVar50 = psVar46->resample_row_hv_2_kernel;
                  }
                  else {
                    pcVar50 = stbi__resample_row_generic;
                  }
                  *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar47) = pcVar50;
                }
                if (pvVar49 == (void *)0x0) break;
                lVar47 = lVar47 + 0x30;
                if ((ulong)uVar64 * 0x30 == lVar47) goto LAB_00145fad;
              }
              goto LAB_00146695;
            }
LAB_00145fad:
            psVar74 = psVar46->s;
            sVar41 = psVar74->img_y;
            psVar51 = (stbi__context *)stbi__malloc_mad3(req_comp,psVar74->img_x,sVar41,1);
            iVar40 = (int)extraout_RDX_13;
            if (psVar51 == (stbi__context *)0x0) {
              stbi__free_jpeg_components(psVar46,psVar74->img_n,iVar40);
              *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
              goto LAB_00146695;
            }
            if (sVar41 != 0) {
              iVar71 = 0;
              uVar76 = 0;
              psVar61 = extraout_RDX_13;
              do {
                sVar41 = psVar74->img_x;
                if (0 < (int)uVar64) {
                  pasVar73 = (stbi_uc (*) [4])&local_88a8.ratio;
                  uVar63 = 0;
                  piVar75 = &psVar46->img_comp[0].y;
                  do {
                    asVar5 = pasVar73[-1];
                    asVar6 = pasVar73[-3];
                    iVar40 = (int)asVar6 >> 1;
                    auVar119 = (**(code **)(pasVar73 + -10))
                                         (*(stbi_uc **)(piVar75 + 10),
                                          *(undefined8 *)
                                           (*pasVar73 +
                                           ((ulong)(iVar40 <= (int)asVar5) << 3 | 0xffffffffffffffe0
                                           )),*(undefined8 *)
                                               (*pasVar73 +
                                               ((ulong)((int)asVar5 < iVar40) << 3 |
                                               0xffffffffffffffe0)),pasVar73[-2]);
                    psVar61 = auVar119._8_8_;
                    *(long *)(local_8948 + uVar63 * 8) = auVar119._0_8_;
                    pasVar73[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                    if ((int)asVar6 <= (int)asVar5 + 1) {
                      pasVar73[-1] = (stbi_uc  [4])0x0;
                      *(stbi_uc **)(pasVar73 + -8) = *(stbi_uc **)(pasVar73 + -6);
                      asVar5 = *pasVar73;
                      *pasVar73 = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar5 + 1 < *piVar75) {
                        *(stbi_uc **)(pasVar73 + -6) = *(stbi_uc **)(pasVar73 + -6) + piVar75[1];
                      }
                    }
                    uVar63 = uVar63 + 1;
                    piVar75 = piVar75 + 0x18;
                    pasVar73 = pasVar73 + 0xc;
                  } while (uVar64 != uVar63);
                }
                if (req_comp < 3) {
                  psVar74 = psVar46->s;
                  if (bVar79) {
                    if (req_comp == 1) {
                      if (psVar74->img_x != 0) {
                        uVar63 = 0;
                        do {
                          bVar38 = *(byte *)(local_8938._0_8_ + uVar63);
                          psVar51->buffer_start[uVar63 + sVar41 * iVar71 + -0x38] =
                               (stbi_uc)((uint)bVar38 * 2 + ((uint)bVar38 + (uint)bVar38 * 8) * 3 +
                                         (uint)stack0xffffffffffff76c0[uVar63] * 0x96 +
                                         (uint)*(byte *)(local_8948._0_8_ + uVar63) * 0x4d >> 8);
                          uVar63 = uVar63 + 1;
                          psVar61 = stack0xffffffffffff76c0;
                        } while (uVar63 < psVar74->img_x);
                      }
                    }
                    else if (psVar74->img_x != 0) {
                      uVar63 = 0;
                      do {
                        bVar38 = *(byte *)(local_8938._0_8_ + uVar63);
                        psVar51->buffer_start[uVar63 * 2 + (ulong)(sVar41 * iVar71) + -0x38] =
                             (stbi_uc)((uint)bVar38 * 2 + ((uint)bVar38 + (uint)bVar38 * 8) * 3 +
                                       (uint)stack0xffffffffffff76c0[uVar63] * 0x96 +
                                       (uint)*(byte *)(local_8948._0_8_ + uVar63) * 0x4d >> 8);
                        psVar51->buffer_start[uVar63 * 2 + (ulong)(sVar41 * iVar71) + -0x37] = 0xff;
                        uVar63 = uVar63 + 1;
                        psVar61 = stack0xffffffffffff76c0;
                      } while (uVar63 < psVar74->img_x);
                    }
                  }
                  else if (psVar74->img_n == 4) {
                    if (psVar46->app14_color_transform == 2) {
                      if (psVar74->img_x != 0) {
                        psVar65 = psVar51->buffer_start + ((ulong)(sVar41 * iVar71) - 0x37);
                        uVar63 = 0;
                        do {
                          iVar40 = (*(byte *)(local_8948._0_8_ + uVar63) ^ 0xff) *
                                   (uint)stack0xffffffffffff76d0[uVar63];
                          psVar65[-1] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          *psVar65 = 0xff;
                          uVar63 = uVar63 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                          psVar61 = stack0xffffffffffff76d0;
                        } while (uVar63 < psVar74->img_x);
                      }
                    }
                    else {
                      if (psVar46->app14_color_transform != 0) goto LAB_00146400;
                      if (psVar74->img_x != 0) {
                        psVar65 = psVar51->buffer_start + ((ulong)(sVar41 * iVar71) - 0x37);
                        uVar63 = 0;
                        do {
                          bVar38 = stack0xffffffffffff76d0[uVar63];
                          iVar40 = (uint)*(byte *)(local_8948._0_8_ + uVar63) * (uint)bVar38;
                          iVar70 = (uint)stack0xffffffffffff76c0[uVar63] * (uint)bVar38;
                          psVar65[-1] = (char)(((uint)*(byte *)(local_8938._0_8_ + uVar63) *
                                                (uint)bVar38 +
                                                ((uint)*(byte *)(local_8938._0_8_ + uVar63) *
                                                 (uint)bVar38 + 0x80 >> 8) + 0x80 >> 8 & 0xff) *
                                               0x1d + (iVar70 + (iVar70 + 0x80U >> 8) + 0x80 >> 8 &
                                                      0xff) * 0x96 +
                                                      (iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8 &
                                                      0xff) * 0x4d >> 8);
                          *psVar65 = 0xff;
                          uVar63 = uVar63 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                          psVar61 = (stbi_uc *)local_8948._0_8_;
                        } while (uVar63 < psVar74->img_x);
                      }
                    }
                  }
                  else {
LAB_00146400:
                    uVar58 = psVar74->img_x;
                    psVar61 = (stbi_uc *)(ulong)uVar58;
                    if (req_comp == 1) {
                      if (uVar58 != 0) {
                        psVar61 = (stbi_uc *)0x0;
                        do {
                          (psVar51->buffer_start + ((ulong)(sVar41 * iVar71) - 0x38))[(long)psVar61]
                               = *(stbi_uc *)(local_8948._0_8_ + (long)psVar61);
                          psVar61 = psVar61 + 1;
                        } while (psVar61 < (stbi_uc *)(ulong)psVar74->img_x);
                      }
                    }
                    else if (uVar58 != 0) {
                      psVar61 = (stbi_uc *)0x0;
                      do {
                        psVar51->buffer_start[(long)psVar61 * 2 + (ulong)(sVar41 * iVar71) + -0x38]
                             = *(stbi_uc *)(local_8948._0_8_ + (long)psVar61);
                        psVar51->buffer_start[(long)psVar61 * 2 + (ulong)(sVar41 * iVar71) + -0x37]
                             = 0xff;
                        psVar61 = psVar61 + 1;
                      } while (psVar61 < (stbi_uc *)(ulong)psVar74->img_x);
                    }
                  }
                }
                else {
                  psVar74 = psVar46->s;
                  if (psVar74->img_n == 3) {
                    if (bVar79) {
                      if (psVar74->img_x != 0) {
                        psVar65 = psVar51->buffer_start + ((ulong)(sVar41 * iVar71) - 0x35);
                        uVar63 = 0;
                        do {
                          psVar65[-3] = *(stbi_uc *)(local_8948._0_8_ + uVar63);
                          psVar65[-2] = stack0xffffffffffff76c0[uVar63];
                          psVar65[-1] = *(stbi_uc *)(local_8938._0_8_ + uVar63);
                          *psVar65 = 0xff;
                          uVar63 = uVar63 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                          psVar61 = (stbi_uc *)local_8938._0_8_;
                        } while (uVar63 < psVar74->img_x);
                      }
                    }
                    else {
LAB_00146473:
                      (*psVar46->YCbCr_to_RGB_kernel)
                                (psVar51->buffer_start +
                                 ((ulong)(uVar76 * req_comp * sVar41) - 0x38),
                                 (stbi_uc *)local_8948._0_8_,stack0xffffffffffff76c0,
                                 (stbi_uc *)local_8938._0_8_,psVar74->img_x,req_comp);
                      psVar61 = extraout_RDX_14;
                    }
                  }
                  else if (psVar74->img_n == 4) {
                    if (psVar46->app14_color_transform == 2) {
                      (*psVar46->YCbCr_to_RGB_kernel)
                                (psVar51->buffer_start +
                                 ((ulong)(uVar76 * req_comp * sVar41) - 0x38),
                                 (stbi_uc *)local_8948._0_8_,stack0xffffffffffff76c0,
                                 (stbi_uc *)local_8938._0_8_,psVar74->img_x,req_comp);
                      psVar74 = psVar46->s;
                      psVar61 = extraout_RDX_15;
                      if (psVar74->img_x != 0) {
                        psVar65 = psVar51->buffer_start + ((ulong)(sVar41 * iVar71) - 0x36);
                        psVar61 = (stbi_uc *)0x0;
                        do {
                          bVar38 = psVar61[(long)stack0xffffffffffff76d0];
                          iVar40 = (psVar65[-2] ^ 0xff) * (uint)bVar38;
                          psVar65[-2] = (byte)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          iVar40 = (psVar65[-1] ^ 0xff) * (uint)bVar38;
                          psVar65[-1] = (byte)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          iVar40 = (*psVar65 ^ 0xff) * (uint)bVar38;
                          *psVar65 = (byte)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          psVar61 = psVar61 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                        } while (psVar61 < (stbi_uc *)(ulong)psVar74->img_x);
                      }
                    }
                    else {
                      if (psVar46->app14_color_transform != 0) goto LAB_00146473;
                      if (psVar74->img_x != 0) {
                        psVar65 = psVar51->buffer_start + ((ulong)(sVar41 * iVar71) - 0x35);
                        uVar63 = 0;
                        do {
                          bVar38 = stack0xffffffffffff76d0[uVar63];
                          iVar40 = (uint)*(byte *)(local_8948._0_8_ + uVar63) * (uint)bVar38;
                          psVar65[-3] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          iVar40 = (uint)stack0xffffffffffff76c0[uVar63] * (uint)bVar38;
                          psVar65[-2] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          psVar65[-1] = (char)(((uint)*(byte *)(local_8938._0_8_ + uVar63) *
                                                (uint)bVar38 + 0x80 >> 8) +
                                               (uint)*(byte *)(local_8938._0_8_ + uVar63) *
                                               (uint)bVar38 + 0x80 >> 8);
                          *psVar65 = 0xff;
                          uVar63 = uVar63 + 1;
                          psVar65 = psVar65 + (uint)req_comp;
                          psVar61 = stack0xffffffffffff76c0;
                        } while (uVar63 < psVar74->img_x);
                      }
                    }
                  }
                  else if (psVar74->img_x != 0) {
                    psVar66 = psVar51->buffer_start + ((ulong)(sVar41 * iVar71) - 0x35);
                    psVar65 = (stbi_uc *)0x0;
                    do {
                      sVar37 = *(stbi_uc *)(local_8948._0_8_ + (long)psVar65);
                      psVar66[-1] = sVar37;
                      psVar66[-2] = sVar37;
                      psVar66[-3] = sVar37;
                      *psVar66 = 0xff;
                      psVar65 = psVar65 + 1;
                      psVar61 = (stbi_uc *)(ulong)psVar74->img_x;
                      psVar66 = psVar66 + (uint)req_comp;
                    } while (psVar65 < psVar61);
                  }
                }
                iVar40 = (int)psVar61;
                uVar76 = uVar76 + 1;
                psVar74 = psVar46->s;
                iVar71 = iVar71 + req_comp;
              } while (uVar76 < psVar74->img_y);
            }
            stbi__free_jpeg_components(psVar46,psVar74->img_n,iVar40);
            psVar74 = psVar46->s;
            *x = psVar74->img_x;
            *y = psVar74->img_y;
            if (local_8920 != (int *)0x0) {
              *local_8920 = (uint)(2 < psVar74->img_n) * 2 + 1;
            }
            goto LAB_0014669b;
          }
          iVar40 = stbi__process_marker(psVar46,(uint)bVar38);
          uVar76 = extraout_EDX_00;
          if (iVar40 != 0) goto LAB_001455a4;
        }
      }
LAB_00146685:
      stbi__free_jpeg_components(psVar46,psVar46->s->img_n,uVar76);
    }
    else {
      *(char **)(in_FS_OFFSET + -0x10) = "bad req_comp";
    }
LAB_00146695:
    psVar51 = (stbi__context *)0x0;
LAB_0014669b:
    free(psVar46);
  }
  else {
    iVar40 = stbi__check_png_header(s);
    psVar65 = s->img_buffer_original;
    s->img_buffer = psVar65;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar40 == 0) {
      if (psVar65 < s->img_buffer_original_end) {
LAB_001457f7:
        s->img_buffer = psVar65 + 1;
        if (*psVar65 != 'B') goto LAB_00145a44;
        psVar65 = s->img_buffer;
        if (s->img_buffer_end <= psVar65) {
          if (s->read_from_callbacks == 0) goto LAB_00145a44;
          psVar65 = s->buffer_start;
          iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
          if (iVar40 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar65;
            s->img_buffer_end = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar65;
            s->img_buffer_end = psVar65 + iVar40;
          }
          psVar65 = s->img_buffer;
        }
        s->img_buffer = psVar65 + 1;
        if (*psVar65 != 'M') goto LAB_00145a44;
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar76 = stbi__get16le(s);
        iVar40 = stbi__get16le(s);
        uVar76 = iVar40 << 0x10 | uVar76;
        if ((((0x38 < uVar76) || ((0x100010000001000U >> ((ulong)uVar76 & 0x3f) & 1) == 0)) &&
            (uVar76 != 0x7c)) && (uVar76 != 0x6c)) goto LAB_00145a44;
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        uStack_892c = 0xff;
        pvVar49 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8948);
        if (pvVar49 == (void *)0x0) goto LAB_00144169;
        local_88e0 = s->img_y;
        sVar41 = -local_88e0;
        if (0 < (int)local_88e0) {
          sVar41 = local_88e0;
        }
        s->img_y = sVar41;
        z_01 = local_8938._8_4_;
        uVar35 = local_8948._0_4_;
        uVar36 = local_8948._8_4_;
        if (local_8948._8_4_ == 0xc) {
          if (0x17 < (int)local_8948._0_4_) goto LAB_00145c14;
          uVar76 = ((local_8948._4_4_ - local_8928) + -0x18) / 3;
LAB_00145c0d:
          local_89c0 = (ulong)uVar76;
        }
        else {
          if ((int)local_8948._0_4_ < 0x10) {
            uVar76 = local_8948._4_4_ - (local_8928 + local_8948._8_4_) >> 2;
            goto LAB_00145c0d;
          }
LAB_00145c14:
          local_89c0 = 0;
        }
        uVar76 = uStack_893c;
        z = local_8938._0_4_;
        z_00 = local_8938._4_4_;
        uVar64 = uStack_892c;
        uVar58 = local_8938._8_4_ ^ 0xff000000;
        s->img_n = 4 - (uint)(local_8938._8_4_ == 0 || local_8948._0_4_ == 0x18 && uVar58 == 0);
        iVar40 = req_comp;
        if (req_comp < 3) {
          iVar40 = s->img_n;
        }
        sVar4 = s->img_x;
        iVar71 = stbi__mad3sizes_valid(iVar40,sVar4,sVar41,0);
        if (iVar71 == 0) {
          pcVar52 = "too large";
        }
        else {
          data_01 = (uchar *)stbi__malloc_mad3(iVar40,sVar4,sVar41,0);
          if (data_01 != (uchar *)0x0) {
            if ((int)uVar35 < 0x10) {
              iVar71 = (int)local_89c0;
              if (0x100 < iVar71 || iVar71 == 0) {
                free(data_01);
                pcVar52 = "invalid";
                goto LAB_00144160;
              }
              if (0 < iVar71) {
                psVar61 = s->buffer_start;
                psVar65 = s->buffer_start + 1;
                uVar63 = 0;
                do {
                  psVar66 = s->img_buffer;
                  if (psVar66 < s->img_buffer_end) {
LAB_00146817:
                    s->img_buffer = psVar66 + 1;
                    sVar37 = *psVar66;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar70 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                      if (iVar70 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar61;
                        s->img_buffer_end = psVar65;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar61;
                        s->img_buffer_end = psVar61 + iVar70;
                      }
                      psVar66 = s->img_buffer;
                      goto LAB_00146817;
                    }
                    sVar37 = '\0';
                  }
                  local_88a8.pal[uVar63 - 0xd][2] = sVar37;
                  psVar66 = s->img_buffer;
                  if (psVar66 < s->img_buffer_end) {
LAB_00146891:
                    s->img_buffer = psVar66 + 1;
                    sVar37 = *psVar66;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar70 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                      if (iVar70 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar61;
                        s->img_buffer_end = psVar65;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar61;
                        s->img_buffer_end = psVar61 + iVar70;
                      }
                      psVar66 = s->img_buffer;
                      goto LAB_00146891;
                    }
                    sVar37 = '\0';
                  }
                  local_88a8.pal[uVar63 - 0xd][1] = sVar37;
                  psVar66 = s->img_buffer;
                  if (psVar66 < s->img_buffer_end) {
LAB_0014690b:
                    s->img_buffer = psVar66 + 1;
                    sVar37 = *psVar66;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar70 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                      if (iVar70 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar61;
                        s->img_buffer_end = psVar65;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar61;
                        s->img_buffer_end = psVar61 + iVar70;
                      }
                      psVar66 = s->img_buffer;
                      goto LAB_0014690b;
                    }
                    sVar37 = '\0';
                  }
                  local_88a8.pal[uVar63 - 0xd][0] = sVar37;
                  if (uVar36 != 0xc) {
                    psVar66 = s->img_buffer;
                    if (s->img_buffer_end <= psVar66) {
                      if (s->read_from_callbacks == 0) goto LAB_00146991;
                      iVar70 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                      if (iVar70 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar61;
                        s->img_buffer_end = psVar65;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar61;
                        s->img_buffer_end = psVar61 + iVar70;
                      }
                      psVar66 = s->img_buffer;
                    }
                    s->img_buffer = psVar66 + 1;
                  }
LAB_00146991:
                  local_88a8.pal[uVar63 - 0xd][3] = 0xff;
                  uVar63 = uVar63 + 1;
                } while (local_89c0 != uVar63);
              }
              stbi__skip(s,(iVar71 * (uVar36 == 0xc | 0xfffffffc) + local_8948._4_4_) -
                           (uVar36 + local_8928));
              if (uVar35 == 8) {
                uVar76 = s->img_x;
              }
              else if (uVar35 == 4) {
                uVar76 = s->img_x + 1 >> 1;
              }
              else {
                if (uVar35 != 1) {
                  free(data_01);
                  pcVar52 = "bad bpp";
                  goto LAB_00144160;
                }
                uVar76 = s->img_x + 7 >> 3;
              }
              local_8988 = -uVar76 & 3;
              if (uVar35 == 1) {
                if (0 < (int)s->img_y) {
                  psVar61 = s->buffer_start;
                  iVar71 = 0;
                  iVar70 = 0;
                  do {
                    pbVar54 = s->img_buffer;
                    if (pbVar54 < s->img_buffer_end) {
LAB_00147986:
                      s->img_buffer = pbVar54 + 1;
                      uVar76 = (uint)*pbVar54;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                        if (iVar42 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar61;
                          s->img_buffer_end = s->buffer_start + 1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar61;
                          s->img_buffer_end = psVar61 + iVar42;
                        }
                        pbVar54 = s->img_buffer;
                        goto LAB_00147986;
                      }
                      uVar76 = 0;
                    }
                    uVar58 = 7;
                    sVar41 = 1;
                    do {
                      sVar4 = s->img_x;
                      if ((int)sVar4 <= (int)(sVar41 - 1)) break;
                      uVar63 = (ulong)((uVar76 >> (uVar58 & 0x1f) & 1) != 0);
                      data_01[iVar71] = local_88a8.pal[uVar63 - 0xd][0];
                      data_01[(long)iVar71 + 1] = local_88a8.pal[uVar63 - 0xd][1];
                      data_01[(long)iVar71 + 2] = local_88a8.pal[uVar63 - 0xd][2];
                      iVar42 = iVar71 + 3;
                      if (iVar40 == 4) {
                        data_01[(long)iVar71 + 3] = 0xff;
                        iVar42 = iVar71 + 4;
                      }
                      iVar71 = iVar42;
                      if (sVar41 != sVar4) {
                        if ((int)uVar58 < 1) {
                          pbVar54 = s->img_buffer;
                          if (pbVar54 < s->img_buffer_end) {
LAB_00147a95:
                            s->img_buffer = pbVar54 + 1;
                            uVar76 = (uint)*pbVar54;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                              if (iVar42 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar61;
                                s->img_buffer_end = s->buffer_start + 1;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar61;
                                s->img_buffer_end = psVar61 + iVar42;
                              }
                              pbVar54 = s->img_buffer;
                              goto LAB_00147a95;
                            }
                            uVar76 = 0;
                          }
                          uVar58 = 7;
                        }
                        else {
                          uVar58 = uVar58 - 1;
                        }
                      }
                      bVar79 = sVar41 != sVar4;
                      sVar41 = sVar41 + 1;
                    } while (bVar79);
                    stbi__skip(s,local_8988);
                    iVar70 = iVar70 + 1;
                  } while (iVar70 < (int)s->img_y);
                }
              }
              else if (0 < (int)s->img_y) {
                psVar61 = s->buffer_start;
                uVar63 = 0;
                iVar71 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    iVar70 = 0;
                    do {
                      pbVar54 = s->img_buffer;
                      if (pbVar54 < s->img_buffer_end) {
LAB_00147bac:
                        s->img_buffer = pbVar54 + 1;
                        uVar76 = (uint)*pbVar54;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                          if (iVar42 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar61;
                            s->img_buffer_end = s->buffer_start + 1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar61;
                            s->img_buffer_end = psVar61 + iVar42;
                          }
                          pbVar54 = s->img_buffer;
                          goto LAB_00147bac;
                        }
                        uVar76 = 0;
                      }
                      uVar58 = uVar76 >> 4;
                      if (uVar35 != 4) {
                        uVar58 = uVar76;
                      }
                      uVar72 = (ulong)uVar58;
                      uVar76 = uVar76 & 0xf;
                      if (uVar35 != 4) {
                        uVar76 = 0;
                      }
                      lVar47 = (long)(int)uVar63;
                      uVar48 = lVar47 + 3;
                      data_01[lVar47] = local_88a8.pal[uVar72 - 0xd][0];
                      data_01[lVar47 + 1] = local_88a8.pal[uVar72 - 0xd][1];
                      data_01[lVar47 + 2] = local_88a8.pal[uVar72 - 0xd][2];
                      if (iVar40 == 4) {
                        data_01[lVar47 + 3] = 0xff;
                        uVar48 = (ulong)((int)uVar63 + 4);
                      }
                      sVar41 = s->img_x;
                      if (iVar70 + 1U == sVar41) {
LAB_00147cfc:
                        uVar63 = uVar48 & 0xffffffff;
                      }
                      else {
                        if (uVar35 == 8) {
                          pbVar54 = s->img_buffer;
                          if (s->img_buffer_end <= pbVar54) {
                            if (s->read_from_callbacks == 0) {
                              uVar76 = 0;
                              goto LAB_00147cb7;
                            }
                            iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                            if (iVar42 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar61;
                              s->img_buffer_end = s->buffer_start + 1;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar61;
                              s->img_buffer_end = psVar61 + iVar42;
                            }
                            pbVar54 = s->img_buffer;
                          }
                          s->img_buffer = pbVar54 + 1;
                          uVar76 = (uint)*pbVar54;
                        }
LAB_00147cb7:
                        lVar47 = (long)(int)uVar48;
                        uVar63 = lVar47 + 3;
                        uVar72 = (ulong)uVar76;
                        data_01[lVar47] = local_88a8.pal[uVar72 - 0xd][0];
                        data_01[lVar47 + 1] = local_88a8.pal[uVar72 - 0xd][1];
                        data_01[lVar47 + 2] = local_88a8.pal[uVar72 - 0xd][2];
                        if (iVar40 == 4) {
                          uVar48 = (ulong)((int)uVar48 + 4);
                          data_01[lVar47 + 3] = 0xff;
                          goto LAB_00147cfc;
                        }
                      }
                    } while ((iVar70 + 1U != sVar41) &&
                            (iVar70 = iVar70 + 2, iVar70 < (int)s->img_x));
                  }
                  stbi__skip(s,local_8988);
                  iVar71 = iVar71 + 1;
                } while (iVar71 < (int)s->img_y);
              }
            }
            else {
              uVar56 = local_8948._4_4_ - (uVar36 + local_8928);
              uVar63 = (ulong)uVar56;
              stbi__skip(s,uVar56);
              if (uVar35 == 0x18) {
                iVar71 = -3;
LAB_00146ab4:
                uVar56 = iVar71 * s->img_x & 3;
              }
              else {
                uVar56 = 0;
                if (uVar35 == 0x10) {
                  iVar71 = -2;
                  goto LAB_00146ab4;
                }
              }
              iVar71 = 0;
              if (uVar35 == 0x18) {
                uVar63 = 0;
LAB_00146b07:
                local_8910 = (anon_struct_96_18_0d0905d3 *)((ulong)local_8910._4_4_ << 0x20);
              }
              else {
                uVar68 = (undefined7)(uVar63 >> 8);
                if (uVar35 != 0x20) {
                  uVar63 = CONCAT71(uVar68,1);
                  goto LAB_00146b07;
                }
                uVar58 = uVar76 ^ 0xff0000 | z ^ 0xff00 | z_00 ^ 0xff | uVar58;
                local_8910 = (anon_struct_96_18_0d0905d3 *)
                             CONCAT44(local_8910._4_4_,CONCAT31((int3)(uVar58 >> 8),uVar58 == 0));
                uVar63 = CONCAT71(uVar68,uVar58 != 0);
              }
              iVar70 = 0;
              local_8964 = 0;
              local_8914 = 0;
              uVar43 = 0;
              uVar57 = 0;
              uVar77 = 0;
              uVar58 = 0;
              local_8904 = (uint)uVar63;
              if ((char)uVar63 == '\0') {
LAB_00146d04:
                bVar79 = true;
                if (0 < (int)s->img_y) {
                  psVar61 = s->buffer_start;
                  local_8900 = s->buffer_start + 1;
                  local_88f8 = (int *)CONCAT44(local_88f8._4_4_,-iVar71);
                  local_88e8 = CONCAT44(local_88e8._4_4_,8 - uVar43);
                  local_88c4 = -iVar70;
                  local_88c8 = 8 - uVar57;
                  local_88cc = -local_8964;
                  local_88d0 = 8 - uVar77;
                  local_88d8 = -local_8914;
                  local_88d4 = 8 - uVar58;
                  iVar44 = 0;
                  local_88f0 = (ulong)(uVar43 << 2);
                  local_88b0 = (ulong)(uVar57 << 2);
                  local_88b8 = (ulong)(uVar77 << 2);
                  local_88c0 = (ulong)(uVar58 << 2);
                  iVar42 = 0;
                  local_8918 = uVar56;
                  do {
                    local_88dc = iVar42;
                    if ((char)uVar63 == '\0') {
                      if (0 < (int)s->img_x) {
                        iVar42 = 0;
                        do {
                          puVar53 = s->img_buffer;
                          if (puVar53 < s->img_buffer_end) {
LAB_00146ff3:
                            s->img_buffer = puVar53 + 1;
                            uVar39 = *puVar53;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar59 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                              if (iVar59 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar61;
                                s->img_buffer_end = local_8900;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar61;
                                s->img_buffer_end = psVar61 + iVar59;
                              }
                              puVar53 = s->img_buffer;
                              goto LAB_00146ff3;
                            }
                            uVar39 = '\0';
                          }
                          data_01[(long)iVar44 + 2] = uVar39;
                          puVar53 = s->img_buffer;
                          if (puVar53 < s->img_buffer_end) {
LAB_0014708d:
                            s->img_buffer = puVar53 + 1;
                            uVar39 = *puVar53;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar59 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                              if (iVar59 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar61;
                                s->img_buffer_end = local_8900;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar61;
                                s->img_buffer_end = psVar61 + iVar59;
                              }
                              puVar53 = s->img_buffer;
                              goto LAB_0014708d;
                            }
                            uVar39 = '\0';
                          }
                          data_01[(long)iVar44 + 1] = uVar39;
                          puVar53 = s->img_buffer;
                          if (puVar53 < s->img_buffer_end) {
LAB_00147124:
                            s->img_buffer = puVar53 + 1;
                            uVar39 = *puVar53;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              iVar59 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                              if (iVar59 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar61;
                                s->img_buffer_end = local_8900;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar61;
                                s->img_buffer_end = psVar61 + iVar59;
                              }
                              puVar53 = s->img_buffer;
                              goto LAB_00147124;
                            }
                            uVar39 = '\0';
                          }
                          data_01[iVar44] = uVar39;
                          bVar38 = 0xff;
                          if ((char)local_8910 != '\0') {
                            pbVar54 = s->img_buffer;
                            if (s->img_buffer_end <= pbVar54) {
                              if (s->read_from_callbacks == 0) {
                                bVar38 = 0;
                                goto LAB_001471d7;
                              }
                              iVar59 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
                              if (iVar59 == 0) {
                                s->read_from_callbacks = 0;
                                s->img_buffer = psVar61;
                                s->img_buffer_end = local_8900;
                                s->buffer_start[0] = '\0';
                              }
                              else {
                                s->img_buffer = psVar61;
                                s->img_buffer_end = psVar61 + iVar59;
                              }
                              pbVar54 = s->img_buffer;
                            }
                            s->img_buffer = pbVar54 + 1;
                            bVar38 = *pbVar54;
                          }
LAB_001471d7:
                          iVar59 = iVar44 + 3;
                          if (iVar40 == 4) {
                            data_01[(long)iVar44 + 3] = bVar38;
                            iVar59 = iVar44 + 4;
                          }
                          iVar44 = iVar59;
                          uVar64 = uVar64 | bVar38;
                          iVar42 = iVar42 + 1;
                        } while (iVar42 < (int)s->img_x);
                      }
                    }
                    else if (0 < (int)s->img_x) {
                      iVar42 = 0;
                      do {
                        uVar58 = stbi__get16le(s);
                        if (uVar35 != 0x10) {
                          iVar59 = stbi__get16le(s);
                          uVar58 = uVar58 | iVar59 << 0x10;
                        }
                        uVar56 = (uVar58 & uVar76) >> ((byte)iVar71 & 0x1f);
                        if (iVar71 < 0) {
                          uVar56 = (uVar58 & uVar76) << ((byte)local_88f8 & 0x1f);
                        }
                        uVar43 = (uVar58 & z) >> ((byte)iVar70 & 0x1f);
                        if (iVar70 < 0) {
                          uVar43 = (uVar58 & z) << ((byte)local_88c4 & 0x1f);
                        }
                        iVar59 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                         local_88b0);
                        bVar38 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b0];
                        uVar57 = (uVar58 & z_00) >> ((byte)local_8964 & 0x1f);
                        if (local_8964 < 0) {
                          uVar57 = (uVar58 & z_00) << ((byte)local_88cc & 0x1f);
                        }
                        iVar118 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                          local_88b8);
                        bVar2 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b8];
                        data_01[iVar44] =
                             (uchar)((int)((uVar56 >> ((byte)local_88e8 & 0x1f)) *
                                          *(int *)(stbi__shiftsigned(unsigned_int,int,int)::
                                                   mul_table + local_88f0)) >>
                                    (stbi__shiftsigned(unsigned_int,int,int)::shift_table
                                     [local_88f0] & 0x1f));
                        data_01[(long)iVar44 + 1] =
                             (uchar)((int)((uVar43 >> ((byte)local_88c8 & 0x1f)) * iVar59) >>
                                    (bVar38 & 0x1f));
                        data_01[(long)iVar44 + 2] =
                             (uchar)((int)((uVar57 >> ((byte)local_88d0 & 0x1f)) * iVar118) >>
                                    (bVar2 & 0x1f));
                        if (z_01 == 0) {
                          uVar58 = 0xff;
                        }
                        else {
                          uVar56 = (uVar58 & z_01) >> ((byte)local_8914 & 0x1f);
                          if (local_8914 < 0) {
                            uVar56 = (uVar58 & z_01) << ((byte)local_88d8 & 0x1f);
                          }
                          uVar58 = (int)((uVar56 >> ((byte)local_88d4 & 0x1f)) *
                                        *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table
                                                + local_88c0)) >>
                                   (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88c0]
                                   & 0x1f);
                        }
                        iVar59 = iVar44 + 3;
                        if (iVar40 == 4) {
                          data_01[(long)iVar44 + 3] = (uchar)uVar58;
                          iVar59 = iVar44 + 4;
                        }
                        iVar44 = iVar59;
                        uVar64 = uVar64 | uVar58;
                        iVar42 = iVar42 + 1;
                      } while (iVar42 < (int)s->img_x);
                    }
                    stbi__skip(s,local_8918);
                    iVar42 = local_88dc + 1;
                    uVar63 = (ulong)local_8904;
                  } while (iVar42 < (int)s->img_y);
                  bVar79 = true;
                }
              }
              else {
                if ((z != 0 && uVar76 != 0) && z_00 != 0) {
                  local_8918 = uVar56;
                  iVar71 = stbi__high_bit(uVar76);
                  iVar71 = iVar71 + -7;
                  uVar58 = (uVar76 >> 1 & 0x55555555) + (uVar76 & 0x55555555);
                  uVar58 = (uVar58 >> 2 & 0x33333333) + (uVar58 & 0x33333333);
                  uVar58 = (uVar58 >> 4) + uVar58 & 0xf0f0f0f;
                  uVar58 = (uVar58 >> 8) + uVar58;
                  uVar43 = (uVar58 >> 0x10) + uVar58 & 0xff;
                  iVar70 = stbi__high_bit(z);
                  iVar70 = iVar70 + -7;
                  uVar58 = ((uint)z >> 1 & 0x55555555) + (z & 0x55555555);
                  uVar58 = (uVar58 >> 2 & 0x33333333) + (uVar58 & 0x33333333);
                  uVar58 = (uVar58 >> 4) + uVar58 & 0xf0f0f0f;
                  uVar58 = (uVar58 >> 8) + uVar58;
                  uVar57 = (uVar58 >> 0x10) + uVar58 & 0xff;
                  local_8964 = stbi__high_bit(z_00);
                  local_8964 = local_8964 + -7;
                  uVar58 = ((uint)z_00 >> 1 & 0x55555555) + (z_00 & 0x55555555);
                  uVar58 = (uVar58 >> 2 & 0x33333333) + (uVar58 & 0x33333333);
                  uVar58 = (uVar58 >> 4) + uVar58 & 0xf0f0f0f;
                  uVar58 = (uVar58 >> 8) + uVar58;
                  uVar77 = (uVar58 >> 0x10) + uVar58 & 0xff;
                  local_8914 = stbi__high_bit(z_01);
                  uVar63 = (ulong)local_8904;
                  local_8914 = local_8914 + -7;
                  uVar58 = ((uint)z_01 >> 1 & 0x55555555) + (z_01 & 0x55555555);
                  uVar58 = (uVar58 >> 2 & 0x33333333) + (uVar58 & 0x33333333);
                  uVar58 = (uVar58 >> 4) + uVar58 & 0xf0f0f0f;
                  uVar58 = (uVar58 >> 8) + uVar58;
                  uVar58 = (uVar58 >> 0x10) + uVar58 & 0xff;
                  uVar56 = local_8918;
                  goto LAB_00146d04;
                }
                free(data_01);
                *(char **)(in_FS_OFFSET + -0x10) = "bad masks";
                bVar79 = false;
              }
              if (!bVar79) goto LAB_00144169;
            }
            auVar34 = _DAT_001599e0;
            auVar33 = _DAT_001599d0;
            auVar32 = _DAT_001585e0;
            auVar31 = _DAT_001585d0;
            auVar30 = _DAT_001585c0;
            auVar29 = _DAT_00158580;
            auVar119 = _DAT_00155050;
            if (((iVar40 == 4) && (uVar64 == 0)) &&
               (uVar76 = s->img_x * s->img_y * 4 - 1, -1 < (int)uVar76)) {
              uVar64 = uVar76 >> 2;
              auVar80._4_4_ = 0;
              auVar80._0_4_ = uVar64;
              auVar80._8_4_ = uVar64;
              auVar80._12_4_ = 0;
              puVar53 = data_01 + uVar76;
              uVar63 = 0;
              do {
                auVar98._8_4_ = (int)uVar63;
                auVar98._0_8_ = uVar63;
                auVar98._12_4_ = (int)(uVar63 >> 0x20);
                auVar100 = auVar80 | auVar119;
                auVar102 = (auVar98 | auVar29) ^ auVar119;
                iVar71 = auVar100._0_4_;
                iVar59 = -(uint)(iVar71 < auVar102._0_4_);
                iVar70 = auVar100._4_4_;
                auVar104._4_4_ = -(uint)(iVar70 < auVar102._4_4_);
                iVar42 = auVar100._8_4_;
                iVar118 = -(uint)(iVar42 < auVar102._8_4_);
                iVar44 = auVar100._12_4_;
                auVar104._12_4_ = -(uint)(iVar44 < auVar102._12_4_);
                auVar81._4_4_ = iVar59;
                auVar81._0_4_ = iVar59;
                auVar81._8_4_ = iVar118;
                auVar81._12_4_ = iVar118;
                auVar81 = pshuflw(in_XMM1,auVar81,0xe8);
                auVar103._4_4_ = -(uint)(auVar102._4_4_ == iVar70);
                auVar103._12_4_ = -(uint)(auVar102._12_4_ == iVar44);
                auVar103._0_4_ = auVar103._4_4_;
                auVar103._8_4_ = auVar103._12_4_;
                auVar90 = pshuflw(in_XMM2,auVar103,0xe8);
                auVar104._0_4_ = auVar104._4_4_;
                auVar104._8_4_ = auVar104._12_4_;
                auVar102 = pshuflw(auVar81,auVar104,0xe8);
                auVar100._8_4_ = 0xffffffff;
                auVar100._0_8_ = 0xffffffffffffffff;
                auVar100._12_4_ = 0xffffffff;
                auVar100 = (auVar102 | auVar90 & auVar81) ^ auVar100;
                auVar100 = packssdw(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *puVar53 = 0xff;
                }
                auVar90._4_4_ = iVar59;
                auVar90._0_4_ = iVar59;
                auVar90._8_4_ = iVar118;
                auVar90._12_4_ = iVar118;
                auVar104 = auVar103 & auVar90 | auVar104;
                auVar100 = packssdw(auVar104,auVar104);
                auVar102._8_4_ = 0xffffffff;
                auVar102._0_8_ = 0xffffffffffffffff;
                auVar102._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 ^ auVar102,auVar100 ^ auVar102);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._0_4_ >> 8 & 1) != 0) {
                  puVar53[-4] = 0xff;
                }
                auVar100 = (auVar98 | auVar32) ^ auVar119;
                auVar91._0_4_ = -(uint)(iVar71 < auVar100._0_4_);
                auVar91._4_4_ = -(uint)(iVar70 < auVar100._4_4_);
                auVar91._8_4_ = -(uint)(iVar42 < auVar100._8_4_);
                auVar91._12_4_ = -(uint)(iVar44 < auVar100._12_4_);
                auVar105._4_4_ = auVar91._0_4_;
                auVar105._0_4_ = auVar91._0_4_;
                auVar105._8_4_ = auVar91._8_4_;
                auVar105._12_4_ = auVar91._8_4_;
                iVar59 = -(uint)(auVar100._4_4_ == iVar70);
                iVar118 = -(uint)(auVar100._12_4_ == iVar44);
                auVar17._4_4_ = iVar59;
                auVar17._0_4_ = iVar59;
                auVar17._8_4_ = iVar118;
                auVar17._12_4_ = iVar118;
                auVar115._4_4_ = auVar91._4_4_;
                auVar115._0_4_ = auVar91._4_4_;
                auVar115._8_4_ = auVar91._12_4_;
                auVar115._12_4_ = auVar91._12_4_;
                auVar100 = auVar17 & auVar105 | auVar115;
                auVar100 = packssdw(auVar100,auVar100);
                auVar8._8_4_ = 0xffffffff;
                auVar8._0_8_ = 0xffffffffffffffff;
                auVar8._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 ^ auVar8,auVar100 ^ auVar8);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._0_4_ >> 0x10 & 1) != 0) {
                  puVar53[-8] = 0xff;
                }
                auVar100 = pshufhw(auVar100,auVar105,0x84);
                auVar18._4_4_ = iVar59;
                auVar18._0_4_ = iVar59;
                auVar18._8_4_ = iVar118;
                auVar18._12_4_ = iVar118;
                auVar102 = pshufhw(auVar91,auVar18,0x84);
                auVar81 = pshufhw(auVar100,auVar115,0x84);
                auVar82._8_4_ = 0xffffffff;
                auVar82._0_8_ = 0xffffffffffffffff;
                auVar82._12_4_ = 0xffffffff;
                auVar82 = (auVar81 | auVar102 & auVar100) ^ auVar82;
                auVar100 = packssdw(auVar82,auVar82);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._0_4_ >> 0x18 & 1) != 0) {
                  puVar53[-0xc] = 0xff;
                }
                auVar100 = (auVar98 | auVar31) ^ auVar119;
                auVar92._0_4_ = -(uint)(iVar71 < auVar100._0_4_);
                auVar92._4_4_ = -(uint)(iVar70 < auVar100._4_4_);
                auVar92._8_4_ = -(uint)(iVar42 < auVar100._8_4_);
                auVar92._12_4_ = -(uint)(iVar44 < auVar100._12_4_);
                auVar19._4_4_ = auVar92._0_4_;
                auVar19._0_4_ = auVar92._0_4_;
                auVar19._8_4_ = auVar92._8_4_;
                auVar19._12_4_ = auVar92._8_4_;
                auVar102 = pshuflw(auVar115,auVar19,0xe8);
                auVar83._0_4_ = -(uint)(auVar100._0_4_ == iVar71);
                auVar83._4_4_ = -(uint)(auVar100._4_4_ == iVar70);
                auVar83._8_4_ = -(uint)(auVar100._8_4_ == iVar42);
                auVar83._12_4_ = -(uint)(auVar100._12_4_ == iVar44);
                auVar106._4_4_ = auVar83._4_4_;
                auVar106._0_4_ = auVar83._4_4_;
                auVar106._8_4_ = auVar83._12_4_;
                auVar106._12_4_ = auVar83._12_4_;
                auVar100 = pshuflw(auVar83,auVar106,0xe8);
                auVar107._4_4_ = auVar92._4_4_;
                auVar107._0_4_ = auVar92._4_4_;
                auVar107._8_4_ = auVar92._12_4_;
                auVar107._12_4_ = auVar92._12_4_;
                auVar81 = pshuflw(auVar92,auVar107,0xe8);
                auVar9._8_4_ = 0xffffffff;
                auVar9._0_8_ = 0xffffffffffffffff;
                auVar9._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 & auVar102,(auVar81 | auVar100 & auVar102) ^ auVar9);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar53[-0x10] = 0xff;
                }
                auVar20._4_4_ = auVar92._0_4_;
                auVar20._0_4_ = auVar92._0_4_;
                auVar20._8_4_ = auVar92._8_4_;
                auVar20._12_4_ = auVar92._8_4_;
                auVar107 = auVar106 & auVar20 | auVar107;
                auVar81 = packssdw(auVar107,auVar107);
                auVar10._8_4_ = 0xffffffff;
                auVar10._0_8_ = 0xffffffffffffffff;
                auVar10._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100,auVar81 ^ auVar10);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._4_2_ >> 8 & 1) != 0) {
                  puVar53[-0x14] = 0xff;
                }
                auVar100 = (auVar98 | auVar30) ^ auVar119;
                auVar93._0_4_ = -(uint)(iVar71 < auVar100._0_4_);
                auVar93._4_4_ = -(uint)(iVar70 < auVar100._4_4_);
                auVar93._8_4_ = -(uint)(iVar42 < auVar100._8_4_);
                auVar93._12_4_ = -(uint)(iVar44 < auVar100._12_4_);
                auVar108._4_4_ = auVar93._0_4_;
                auVar108._0_4_ = auVar93._0_4_;
                auVar108._8_4_ = auVar93._8_4_;
                auVar108._12_4_ = auVar93._8_4_;
                iVar59 = -(uint)(auVar100._4_4_ == iVar70);
                iVar118 = -(uint)(auVar100._12_4_ == iVar44);
                auVar21._4_4_ = iVar59;
                auVar21._0_4_ = iVar59;
                auVar21._8_4_ = iVar118;
                auVar21._12_4_ = iVar118;
                auVar116._4_4_ = auVar93._4_4_;
                auVar116._0_4_ = auVar93._4_4_;
                auVar116._8_4_ = auVar93._12_4_;
                auVar116._12_4_ = auVar93._12_4_;
                auVar100 = auVar21 & auVar108 | auVar116;
                auVar100 = packssdw(auVar100,auVar100);
                auVar11._8_4_ = 0xffffffff;
                auVar11._0_8_ = 0xffffffffffffffff;
                auVar11._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 ^ auVar11,auVar100 ^ auVar11);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar53[-0x18] = 0xff;
                }
                auVar100 = pshufhw(auVar100,auVar108,0x84);
                auVar22._4_4_ = iVar59;
                auVar22._0_4_ = iVar59;
                auVar22._8_4_ = iVar118;
                auVar22._12_4_ = iVar118;
                auVar102 = pshufhw(auVar93,auVar22,0x84);
                auVar81 = pshufhw(auVar100,auVar116,0x84);
                auVar84._8_4_ = 0xffffffff;
                auVar84._0_8_ = 0xffffffffffffffff;
                auVar84._12_4_ = 0xffffffff;
                auVar84 = (auVar81 | auVar102 & auVar100) ^ auVar84;
                auVar100 = packssdw(auVar84,auVar84);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._6_2_ >> 8 & 1) != 0) {
                  puVar53[-0x1c] = 0xff;
                }
                auVar100 = (auVar98 | auVar34) ^ auVar119;
                auVar94._0_4_ = -(uint)(iVar71 < auVar100._0_4_);
                auVar94._4_4_ = -(uint)(iVar70 < auVar100._4_4_);
                auVar94._8_4_ = -(uint)(iVar42 < auVar100._8_4_);
                auVar94._12_4_ = -(uint)(iVar44 < auVar100._12_4_);
                auVar23._4_4_ = auVar94._0_4_;
                auVar23._0_4_ = auVar94._0_4_;
                auVar23._8_4_ = auVar94._8_4_;
                auVar23._12_4_ = auVar94._8_4_;
                auVar102 = pshuflw(auVar116,auVar23,0xe8);
                auVar85._0_4_ = -(uint)(auVar100._0_4_ == iVar71);
                auVar85._4_4_ = -(uint)(auVar100._4_4_ == iVar70);
                auVar85._8_4_ = -(uint)(auVar100._8_4_ == iVar42);
                auVar85._12_4_ = -(uint)(auVar100._12_4_ == iVar44);
                auVar109._4_4_ = auVar85._4_4_;
                auVar109._0_4_ = auVar85._4_4_;
                auVar109._8_4_ = auVar85._12_4_;
                auVar109._12_4_ = auVar85._12_4_;
                auVar100 = pshuflw(auVar85,auVar109,0xe8);
                auVar110._4_4_ = auVar94._4_4_;
                auVar110._0_4_ = auVar94._4_4_;
                auVar110._8_4_ = auVar94._12_4_;
                auVar110._12_4_ = auVar94._12_4_;
                auVar81 = pshuflw(auVar94,auVar110,0xe8);
                auVar95._8_4_ = 0xffffffff;
                auVar95._0_8_ = 0xffffffffffffffff;
                auVar95._12_4_ = 0xffffffff;
                auVar95 = (auVar81 | auVar100 & auVar102) ^ auVar95;
                auVar81 = packssdw(auVar95,auVar95);
                auVar100 = packsswb(auVar100 & auVar102,auVar81);
                if ((auVar100 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  puVar53[-0x20] = 0xff;
                }
                auVar24._4_4_ = auVar94._0_4_;
                auVar24._0_4_ = auVar94._0_4_;
                auVar24._8_4_ = auVar94._8_4_;
                auVar24._12_4_ = auVar94._8_4_;
                auVar110 = auVar109 & auVar24 | auVar110;
                auVar81 = packssdw(auVar110,auVar110);
                auVar12._8_4_ = 0xffffffff;
                auVar12._0_8_ = 0xffffffffffffffff;
                auVar12._12_4_ = 0xffffffff;
                auVar81 = packssdw(auVar81 ^ auVar12,auVar81 ^ auVar12);
                auVar100 = packsswb(auVar100,auVar81);
                if ((auVar100._8_2_ >> 8 & 1) != 0) {
                  puVar53[-0x24] = 0xff;
                }
                auVar100 = (auVar98 | auVar33) ^ auVar119;
                auVar96._0_4_ = -(uint)(iVar71 < auVar100._0_4_);
                auVar96._4_4_ = -(uint)(iVar70 < auVar100._4_4_);
                auVar96._8_4_ = -(uint)(iVar42 < auVar100._8_4_);
                auVar96._12_4_ = -(uint)(iVar44 < auVar100._12_4_);
                auVar111._4_4_ = auVar96._0_4_;
                auVar111._0_4_ = auVar96._0_4_;
                auVar111._8_4_ = auVar96._8_4_;
                auVar111._12_4_ = auVar96._8_4_;
                iVar59 = -(uint)(auVar100._4_4_ == iVar70);
                iVar118 = -(uint)(auVar100._12_4_ == iVar44);
                auVar25._4_4_ = iVar59;
                auVar25._0_4_ = iVar59;
                auVar25._8_4_ = iVar118;
                auVar25._12_4_ = iVar118;
                auVar117._4_4_ = auVar96._4_4_;
                auVar117._0_4_ = auVar96._4_4_;
                auVar117._8_4_ = auVar96._12_4_;
                auVar117._12_4_ = auVar96._12_4_;
                auVar100 = auVar25 & auVar111 | auVar117;
                auVar100 = packssdw(auVar100,auVar100);
                auVar13._8_4_ = 0xffffffff;
                auVar13._0_8_ = 0xffffffffffffffff;
                auVar13._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 ^ auVar13,auVar100 ^ auVar13);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  puVar53[-0x28] = 0xff;
                }
                auVar100 = pshufhw(auVar100,auVar111,0x84);
                auVar26._4_4_ = iVar59;
                auVar26._0_4_ = iVar59;
                auVar26._8_4_ = iVar118;
                auVar26._12_4_ = iVar118;
                auVar102 = pshufhw(auVar96,auVar26,0x84);
                auVar81 = pshufhw(auVar100,auVar117,0x84);
                auVar86._8_4_ = 0xffffffff;
                auVar86._0_8_ = 0xffffffffffffffff;
                auVar86._12_4_ = 0xffffffff;
                auVar86 = (auVar81 | auVar102 & auVar100) ^ auVar86;
                auVar100 = packssdw(auVar86,auVar86);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._10_2_ >> 8 & 1) != 0) {
                  puVar53[-0x2c] = 0xff;
                }
                auVar100 = (auVar98 | _DAT_001599c0) ^ auVar119;
                auVar97._0_4_ = -(uint)(iVar71 < auVar100._0_4_);
                auVar97._4_4_ = -(uint)(iVar70 < auVar100._4_4_);
                auVar97._8_4_ = -(uint)(iVar42 < auVar100._8_4_);
                auVar97._12_4_ = -(uint)(iVar44 < auVar100._12_4_);
                auVar27._4_4_ = auVar97._0_4_;
                auVar27._0_4_ = auVar97._0_4_;
                auVar27._8_4_ = auVar97._8_4_;
                auVar27._12_4_ = auVar97._8_4_;
                auVar102 = pshuflw(auVar117,auVar27,0xe8);
                auVar87._0_4_ = -(uint)(auVar100._0_4_ == iVar71);
                auVar87._4_4_ = -(uint)(auVar100._4_4_ == iVar70);
                auVar87._8_4_ = -(uint)(auVar100._8_4_ == iVar42);
                auVar87._12_4_ = -(uint)(auVar100._12_4_ == iVar44);
                auVar112._4_4_ = auVar87._4_4_;
                auVar112._0_4_ = auVar87._4_4_;
                auVar112._8_4_ = auVar87._12_4_;
                auVar112._12_4_ = auVar87._12_4_;
                auVar100 = pshuflw(auVar87,auVar112,0xe8);
                auVar113._4_4_ = auVar97._4_4_;
                auVar113._0_4_ = auVar97._4_4_;
                auVar113._8_4_ = auVar97._12_4_;
                auVar113._12_4_ = auVar97._12_4_;
                auVar81 = pshuflw(auVar97,auVar113,0xe8);
                auVar14._8_4_ = 0xffffffff;
                auVar14._0_8_ = 0xffffffffffffffff;
                auVar14._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 & auVar102,(auVar81 | auVar100 & auVar102) ^ auVar14);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar53[-0x30] = 0xff;
                }
                auVar28._4_4_ = auVar97._0_4_;
                auVar28._0_4_ = auVar97._0_4_;
                auVar28._8_4_ = auVar97._8_4_;
                auVar28._12_4_ = auVar97._8_4_;
                auVar113 = auVar112 & auVar28 | auVar113;
                auVar81 = packssdw(auVar113,auVar113);
                auVar15._8_4_ = 0xffffffff;
                auVar15._0_8_ = 0xffffffffffffffff;
                auVar15._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100,auVar81 ^ auVar15);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._12_2_ >> 8 & 1) != 0) {
                  puVar53[-0x34] = 0xff;
                }
                auVar100 = (auVar98 | _DAT_001599b0) ^ auVar119;
                auVar88._0_4_ = -(uint)(iVar71 < auVar100._0_4_);
                auVar88._4_4_ = -(uint)(iVar70 < auVar100._4_4_);
                auVar88._8_4_ = -(uint)(iVar42 < auVar100._8_4_);
                auVar88._12_4_ = -(uint)(iVar44 < auVar100._12_4_);
                auVar114._4_4_ = auVar88._0_4_;
                auVar114._0_4_ = auVar88._0_4_;
                auVar114._8_4_ = auVar88._8_4_;
                auVar114._12_4_ = auVar88._8_4_;
                auVar99._4_4_ = -(uint)(auVar100._4_4_ == iVar70);
                auVar99._12_4_ = -(uint)(auVar100._12_4_ == iVar44);
                auVar99._0_4_ = auVar99._4_4_;
                auVar99._8_4_ = auVar99._12_4_;
                auVar101._4_4_ = auVar88._4_4_;
                auVar101._0_4_ = auVar88._4_4_;
                auVar101._8_4_ = auVar88._12_4_;
                auVar101._12_4_ = auVar88._12_4_;
                auVar81 = auVar99 & auVar114 | auVar101;
                auVar100 = packssdw(auVar88,auVar81);
                auVar16._8_4_ = 0xffffffff;
                auVar16._0_8_ = 0xffffffffffffffff;
                auVar16._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 ^ auVar16,auVar100 ^ auVar16);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar53[-0x38] = 0xff;
                }
                auVar100 = pshufhw(auVar100,auVar114,0x84);
                in_XMM2 = pshufhw(auVar81,auVar99,0x84);
                in_XMM2 = in_XMM2 & auVar100;
                auVar100 = pshufhw(auVar100,auVar101,0x84);
                auVar89._8_4_ = 0xffffffff;
                auVar89._0_8_ = 0xffffffffffffffff;
                auVar89._12_4_ = 0xffffffff;
                auVar89 = (auVar100 | in_XMM2) ^ auVar89;
                auVar100 = packssdw(auVar89,auVar89);
                in_XMM1 = packsswb(auVar100,auVar100);
                if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                  puVar53[-0x3c] = 0xff;
                }
                uVar63 = uVar63 + 0x10;
                puVar53 = puVar53 + -0x40;
              } while ((uVar64 + 0x10 & 0x3ffffff0) != uVar63);
            }
            if (0 < (int)local_88e0) {
              uVar76 = (int)s->img_y >> 1;
              if (0 < (int)uVar76) {
                uVar58 = s->img_x * iVar40;
                uVar64 = (s->img_y - 1) * uVar58;
                uVar63 = 0;
                uVar72 = 0;
                do {
                  if (0 < (int)uVar58) {
                    uVar48 = 0;
                    do {
                      uVar39 = data_01[uVar48 + uVar63];
                      data_01[uVar48 + uVar63] = data_01[uVar48 + uVar64];
                      data_01[uVar48 + uVar64] = uVar39;
                      uVar48 = uVar48 + 1;
                    } while (uVar58 != uVar48);
                  }
                  uVar72 = uVar72 + 1;
                  uVar64 = uVar64 - uVar58;
                  uVar63 = (ulong)((int)uVar63 + uVar58);
                } while (uVar72 != uVar76);
              }
            }
            if ((iVar40 == req_comp || req_comp == 0) ||
               (data_01 = stbi__convert_format(data_01,iVar40,req_comp,s->img_x,s->img_y),
               data_01 != (uchar *)0x0)) {
              *x = s->img_x;
              *y = s->img_y;
              if (local_8920 == (int *)0x0) {
                return data_01;
              }
              *local_8920 = s->img_n;
              return data_01;
            }
            goto LAB_00144169;
          }
          pcVar52 = "outofmem";
        }
      }
      else {
        if (s->read_from_callbacks != 0) {
          psVar65 = s->buffer_start;
          iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar65,s->buflen);
          if (iVar40 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar65;
            s->img_buffer_end = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar65;
            s->img_buffer_end = psVar65 + iVar40;
          }
          psVar65 = s->img_buffer;
          goto LAB_001457f7;
        }
LAB_00145a44:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        iVar40 = stbi__gif_test(s);
        if (iVar40 != 0) {
          memset(&local_88a8,0,0x8870);
          psVar51 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,local_8920,0,psVar61);
          if (psVar51 == s) {
            psVar51 = (stbi__context *)0x0;
          }
          if (psVar51 == (stbi__context *)0x0) {
            if (local_88a8.out != (stbi_uc *)0x0) {
              free(local_88a8.out);
            }
            psVar51 = (stbi__context *)0x0;
          }
          else {
            *x = local_88a8.w;
            *y = local_88a8.h;
            if ((req_comp & 0xfffffffbU) != 0) {
              psVar51 = (stbi__context *)
                        stbi__convert_format((uchar *)psVar51,4,req_comp,local_88a8.w,local_88a8.h);
            }
          }
          free(local_88a8.history);
          psVar46 = (stbi__jpeg *)local_88a8.background;
          goto LAB_0014669b;
        }
        iVar40 = stbi__psd_test(s);
        if (iVar40 != 0) {
          pvVar49 = stbi__psd_load(s,x,y,local_8920,req_comp,ri,bpc);
          return pvVar49;
        }
        iVar40 = stbi__pic_test(s);
        if (iVar40 != 0) {
          pvVar49 = stbi__pic_load(s,x,y,local_8920,req_comp,ri_00);
          return pvVar49;
        }
        iVar40 = stbi__pnm_test(s);
        piVar75 = local_8920;
        if (iVar40 != 0) {
          pvVar49 = stbi__pnm_load(s,x,y,local_8920,req_comp,ri_00);
          return pvVar49;
        }
        iVar40 = stbi__hdr_test(s);
        if (iVar40 != 0) {
          data_02 = stbi__hdr_load(s,x,y,piVar75,req_comp,ri_00);
          if (req_comp == 0) {
            req_comp = *piVar75;
          }
          psVar61 = stbi__hdr_to_ldr(data_02,*x,*y,req_comp);
          return psVar61;
        }
        iVar40 = stbi__tga_test(s);
        if (iVar40 != 0) {
          pvVar49 = stbi__tga_load(s,x,y,piVar75,req_comp,ri_00);
          return pvVar49;
        }
        pcVar52 = "unknown image type";
      }
LAB_00144160:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar52;
    }
    else {
      if (4 < (uint)req_comp) {
        pcVar52 = "bad req_comp";
        goto LAB_00144160;
      }
      local_88a8._0_8_ = s;
      iVar40 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      data_00 = (stbi__uint16 *)local_88a8.history;
      uVar7 = local_88a8._0_8_;
      psVar78 = (stbi__uint16 *)0x0;
      if (iVar40 == 0) goto LAB_001458a1;
      iVar40 = 8;
      if (8 < local_88a8.flags) {
        iVar40 = local_88a8.flags;
      }
      ri->bits_per_channel = iVar40;
      local_88a8.history = (stbi_uc *)0x0;
      if ((req_comp == 0) || (iVar40 = *(int *)(local_88a8._0_8_ + 0xc), iVar40 == req_comp)) {
LAB_0014586e:
        *x = *(stbi__uint32 *)local_88a8._0_8_;
        *y = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar78 = data_00;
        if (local_8920 != (int *)0x0) {
          *local_8920 = *(int *)(local_88a8._0_8_ + 8);
        }
LAB_001458a1:
        free(local_88a8.history);
        local_88a8.history = (stbi_uc *)0x0;
        free(local_88a8.background);
        local_88a8.background = (stbi_uc *)0x0;
        free(local_88a8.out);
        return psVar78;
      }
      if (local_88a8.flags < 9) {
        data_00 = (stbi__uint16 *)
                  stbi__convert_format
                            ((uchar *)data_00,iVar40,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                             *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      else {
        data_00 = stbi__convert_format16
                            (data_00,iVar40,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                             *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      *(int *)(uVar7 + 0xc) = req_comp;
      if (data_00 != (stbi__uint16 *)0x0) goto LAB_0014586e;
    }
LAB_00144169:
    psVar51 = (stbi__context *)0x0;
  }
  return psVar51;
LAB_00145580:
  iVar40 = 0;
LAB_00145593:
  if (iVar40 == 0) goto LAB_00146685;
  if (psVar46->marker != 0xff) goto LAB_001455a4;
LAB_001455ae:
  do {
    psVar51 = psVar46->s;
    if ((psVar51->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001455ce:
      if (psVar51->img_buffer_end <= psVar51->img_buffer) goto LAB_001455a4;
    }
    else {
      iVar40 = (*(psVar51->io).eof)(psVar51->io_user_data);
      if (iVar40 != 0) {
        if (psVar51->read_from_callbacks != 0) goto LAB_001455ce;
        goto LAB_001455a4;
      }
    }
    psVar51 = psVar46->s;
    psVar61 = psVar51->img_buffer;
    if (psVar51->img_buffer_end <= psVar61) {
      if (psVar51->read_from_callbacks == 0) goto LAB_001455ae;
      psVar61 = psVar51->buffer_start;
      iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
      if (iVar40 == 0) {
        psVar51->read_from_callbacks = 0;
        psVar51->img_buffer = psVar61;
        psVar51->img_buffer_end = psVar51->buffer_start + 1;
        psVar51->buffer_start[0] = '\0';
      }
      else {
        psVar51->img_buffer = psVar61;
        psVar51->img_buffer_end = psVar61 + iVar40;
      }
      psVar61 = psVar51->img_buffer;
    }
    psVar51->img_buffer = psVar61 + 1;
  } while (*psVar61 != 0xff);
  psVar51 = psVar46->s;
  psVar61 = psVar51->img_buffer;
  if (psVar61 < psVar51->img_buffer_end) {
LAB_001456d8:
    psVar51->img_buffer = psVar61 + 1;
    sVar37 = *psVar61;
  }
  else {
    if (psVar51->read_from_callbacks != 0) {
      psVar61 = psVar51->buffer_start;
      iVar40 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar61,psVar51->buflen);
      if (iVar40 == 0) {
        psVar51->read_from_callbacks = 0;
        psVar51->img_buffer = psVar61;
        psVar51->img_buffer_end = psVar51->buffer_start + 1;
        psVar51->buffer_start[0] = '\0';
      }
      else {
        psVar51->img_buffer = psVar61;
        psVar51->img_buffer_end = psVar61 + iVar40;
      }
      psVar61 = psVar51->img_buffer;
      goto LAB_001456d8;
    }
    sVar37 = '\0';
  }
  psVar46->marker = sVar37;
LAB_001455a4:
  bVar38 = stbi__get_marker(psVar46);
  goto LAB_00144203;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}